

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O3

void work_mgga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  undefined1 auVar125 [16];
  double dVar148;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  double dVar149;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  double __x;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  double dVar206;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  double __x_00;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  double dVar261;
  double dVar263;
  double dVar264;
  double dVar265;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  double dVar262;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  double dVar284;
  double dVar288;
  double dVar314;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  double dVar285;
  double dVar286;
  undefined1 auVar292 [16];
  double dVar287;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  double dVar315;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  double dVar316;
  double dVar317;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  double dVar318;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  double dVar341;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar359;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  double dVar360;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  double dVar361;
  double dVar362;
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  double dVar378;
  double dVar379;
  double dVar380;
  double dVar381;
  double dVar382;
  double dVar383;
  double dVar384;
  double dVar385;
  undefined1 auVar386 [16];
  double dVar393;
  undefined1 auVar387 [16];
  double dVar394;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  double dVar395;
  double dVar396;
  double dVar397;
  double dVar398;
  double dVar399;
  double dVar400;
  double dVar401;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  double dVar411;
  double dVar412;
  double dVar413;
  double dVar414;
  double dVar415;
  double dVar416;
  undefined1 auVar417 [16];
  double dVar420;
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  double dVar421;
  double dVar422;
  double dVar423;
  double dVar424;
  double dVar425;
  double dVar426;
  double dVar434;
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  double dVar435;
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  double dVar436;
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  double dVar437;
  double dVar438;
  double dVar439;
  double dVar440;
  double dVar441;
  double dVar442;
  undefined1 auVar443 [16];
  double dVar446;
  undefined1 auVar444 [16];
  double dVar447;
  undefined1 auVar445 [16];
  double dVar448;
  double dVar449;
  double dVar450;
  double dVar451;
  double dVar452;
  double dVar453;
  undefined1 auVar454 [16];
  double dVar460;
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  double local_c20;
  double local_c08;
  double local_b70;
  double local_b48;
  double dStack_b40;
  double local_b28;
  double dStack_b20;
  double local_af0;
  double local_ae8;
  double local_a38;
  uint local_9b8;
  uint uStack_9b4;
  double local_858;
  double local_848;
  double local_818;
  double local_808;
  double local_7b8;
  double dStack_7b0;
  double local_738;
  double dStack_730;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  undefined8 local_688;
  undefined1 local_608 [32];
  double local_5e8;
  double dStack_5e0;
  double local_5b8;
  double dStack_5b0;
  undefined1 local_408 [144];
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_268;
  double local_258;
  uint local_198;
  uint uStack_194;
  double dVar410;
  
  if (np != 0) {
    local_af0 = 0.0;
    sVar9 = 0;
    local_ae8 = 0.0;
    local_c20 = 0.0;
    __x_00 = 0.0;
    do {
      iVar2 = p->nspin;
      lVar7 = (long)(p->dim).rho * sVar9;
      dVar24 = rho[lVar7];
      if (iVar2 == 2) {
        dVar24 = dVar24 + rho[lVar7 + 1];
      }
      dVar77 = p->dens_threshold;
      if (dVar77 <= dVar24) {
        dVar24 = rho[lVar7];
        if (rho[lVar7] <= dVar77) {
          dVar24 = dVar77;
        }
        dVar25 = p->sigma_threshold * p->sigma_threshold;
        lVar8 = (long)(p->dim).sigma * sVar9;
        local_b70 = sigma[lVar8];
        if (sigma[lVar8] <= dVar25) {
          local_b70 = dVar25;
        }
        uVar3 = p->info->flags;
        if ((uVar3 >> 0x10 & 1) == 0) {
          if (iVar2 == 2) {
            __x_00 = rho[lVar7 + 1];
            if (rho[lVar7 + 1] <= dVar77) {
              __x_00 = dVar77;
            }
            local_c20 = sigma[lVar8 + 2];
            if (sigma[lVar8 + 2] <= dVar25) {
              local_c20 = dVar25;
            }
          }
        }
        else {
          dVar30 = p->tau_threshold;
          lVar10 = (long)(p->dim).tau * sVar9;
          local_ae8 = tau[lVar10];
          if (tau[lVar10] <= dVar30) {
            local_ae8 = dVar30;
          }
          if (((uVar3 >> 0x11 & 1) != 0) && (dVar26 = dVar24 * 8.0 * local_ae8, dVar26 <= local_b70)
             ) {
            local_b70 = dVar26;
          }
          if (iVar2 == 2) {
            __x_00 = rho[lVar7 + 1];
            if (rho[lVar7 + 1] <= dVar77) {
              __x_00 = dVar77;
            }
            local_c20 = sigma[lVar8 + 2];
            if (sigma[lVar8 + 2] <= dVar25) {
              local_c20 = dVar25;
            }
            local_af0 = tau[lVar10 + 1];
            if (tau[lVar10 + 1] <= dVar30) {
              local_af0 = dVar30;
            }
            if (((uVar3 >> 0x11 & 1) != 0) &&
               (dVar25 = __x_00 * 8.0 * local_af0, dVar25 <= local_c20)) {
              local_c20 = dVar25;
            }
          }
        }
        __x = dVar24 + __x_00;
        dVar97 = 1.0 / __x;
        dVar203 = (dVar24 + dVar24) * dVar97;
        dVar25 = p->zeta_threshold;
        dVar284 = dVar25 + -1.0;
        dVar150 = (__x_00 + __x_00) * dVar97;
        dVar316 = -dVar284;
        dVar26 = dVar24 - __x_00;
        dVar233 = dVar26 * dVar97;
        uVar11 = -(ulong)(dVar150 <= dVar25);
        uVar12 = -(ulong)(dVar203 <= dVar25);
        dVar151 = (double)(uVar12 & (ulong)dVar284 |
                          ~uVar12 & (~uVar11 & (ulong)dVar233 | uVar11 & (ulong)dVar316)) + 1.0;
        dVar27 = cbrt(dVar25);
        dVar28 = cbrt(dVar151);
        uVar13 = -(ulong)(dVar151 <= dVar25);
        dVar29 = cbrt(__x);
        dVar30 = cbrt(9.0);
        dVar31 = cbrt(0.3183098861837907);
        dVar31 = dVar31 * dVar31 * dVar30 * dVar30;
        dVar98 = p->cam_omega * dVar31;
        dVar32 = 1.0 / dVar29;
        dVar33 = cbrt(9.869604401089358);
        dVar34 = 1.0 / (dVar33 * dVar33);
        dVar35 = dVar34 * 1.8171205928321397;
        dVar99 = dVar24 * dVar24;
        dVar36 = cbrt(dVar24);
        dVar100 = 1.0 / (dVar36 * dVar36);
        dVar37 = dVar100 / dVar99;
        dVar152 = local_b70 * dVar37;
        dVar101 = ((1.0 / dVar33) / 9.869604401089358) * 3.3019272488946267;
        dVar204 = (1.0 / dVar36) / (dVar24 * dVar99 * dVar99);
        dVar38 = dVar35 * 0.1504548888888889;
        dVar39 = local_b70 * local_b70 * dVar101 * 0.002689949046226295 * dVar204 +
                 dVar38 * dVar152 + 1.0;
        dVar40 = pow(dVar39,0.1);
        dVar30 = p->zeta_threshold;
        uVar14 = -(ulong)(1.0 - dVar233 <= dVar30);
        uVar15 = -(ulong)(dVar233 + 1.0 <= dVar30);
        dVar41 = (double)(~uVar15 & (uVar14 & (ulong)dVar316 | ~uVar14 & (ulong)dVar233) |
                         uVar15 & (ulong)dVar284) + 1.0;
        dVar42 = cbrt(dVar41);
        uVar16 = -(ulong)(dVar41 <= dVar30);
        dVar41 = (double)(uVar16 & (ulong)dVar27 | ~uVar16 & (ulong)dVar42);
        auVar125._8_8_ = dVar41;
        auVar125._0_8_ = dVar40;
        auVar125 = divpd(_DAT_01025040,auVar125);
        dVar40 = auVar125._0_8_;
        dVar148 = auVar125._8_8_;
        dVar102 = dVar32 * 1.4422495703074083 * dVar98;
        dVar103 = (dVar102 * dVar40 * dVar148) / 18.0;
        dVar30 = 1e-10;
        if (1e-10 <= dVar103) {
          dVar30 = dVar103;
        }
        dVar104 = 1.35;
        if (dVar30 <= 1.35) {
          dVar104 = dVar30;
        }
        dVar43 = 1.0 / dVar104;
        dVar44 = erf(dVar43 * 0.5);
        dVar105 = dVar104 * dVar104;
        dVar45 = exp((1.0 / dVar105) * -0.25);
        dVar71 = dVar30;
        if (dVar30 <= 1.35) {
          dVar71 = 1.35;
        }
        dVar342 = dVar71 * dVar71;
        dVar361 = dVar342 * dVar342;
        dVar205 = dVar361 * dVar361;
        auVar266._0_8_ = dVar205 * dVar205;
        auVar266._8_8_ = dVar205;
        auVar125 = divpd(_DAT_01025040,auVar266);
        dVar317 = dVar105 * -2.0 * (dVar45 + -1.0) + dVar45 + -1.5;
        dVar205 = dVar104 + dVar104;
        dVar44 = dVar205 * dVar317 + dVar44 * 1.7724538509055159;
        dVar314 = auVar125._8_8_;
        auVar417._8_8_ = dVar314;
        auVar417._0_8_ = dVar314;
        if (dVar30 < 1.35) {
          local_848 = dVar104 * -2.6666666666666665 * dVar44 + 1.0;
        }
        else {
          auVar246._0_8_ = dVar314 / (dVar342 * dVar361);
          auVar166._0_8_ = 1.0 / (dVar342 * dVar361);
          auVar215._8_8_ = dVar361;
          auVar215._0_8_ = dVar342;
          auVar266 = divpd(_DAT_01025040,auVar215);
          auVar267 = divpd(auVar266,_DAT_010339c0);
          auVar166._8_8_ = dVar314;
          auVar166 = divpd(auVar166,_DAT_010339d0);
          auVar266 = divpd(auVar417,auVar215);
          auVar215 = divpd(auVar266,_DAT_010339e0);
          auVar246._8_8_ = auVar125._0_8_;
          auVar266 = divpd(auVar246,_DAT_010339f0);
          local_848 = ((((((auVar267._0_8_ - auVar267._8_8_) + auVar166._0_8_) - auVar166._8_8_) +
                        auVar215._0_8_) - auVar215._8_8_) + auVar266._0_8_) - auVar266._8_8_;
        }
        dVar46 = (double)(~uVar13 & (ulong)(dVar28 * dVar151) | uVar13 & (ulong)(dVar25 * dVar27));
        dVar47 = pow(dVar39,0.2);
        dVar151 = 0.27;
        if (dVar30 <= 0.27) {
          dVar151 = dVar30;
        }
        dVar106 = dVar151 * dVar151;
        dVar48 = exp((-1.0 / dVar106) * 0.25);
        dVar49 = erf((1.0 / dVar151) * 0.5);
        dVar121 = dVar30;
        if (dVar30 <= 0.27) {
          dVar121 = 0.27;
        }
        dVar378 = dVar121 * dVar121;
        dVar411 = dVar378 * dVar378;
        dVar395 = dVar411 * dVar411;
        dVar261 = dVar395 * dVar395;
        auVar267._8_8_ = dVar261 * dVar261;
        auVar267._0_8_ = dVar261;
        auVar266 = divpd(_DAT_01025040,auVar267);
        dVar234 = dVar106 * dVar106 * 64.0;
        dVar153 = dVar106 * 20.0 - dVar234;
        dVar234 = dVar106 * -36.0 + dVar151 * 17.724538509055158 * dVar49 + dVar153 * dVar48 +
                  dVar234 + -3.0;
        dVar343 = auVar266._0_8_;
        dVar359 = auVar266._8_8_;
        auVar403._8_8_ = dVar343;
        auVar403._0_8_ = dVar343;
        if (dVar30 < 0.27) {
          dVar235 = dVar106 * 24.0 * dVar234 + 1.0;
        }
        else {
          auVar219._0_8_ = dVar395 * dVar378;
          auVar219._8_8_ = dVar261 * dVar378;
          auVar269._0_8_ = dVar411 * dVar395;
          auVar216._8_8_ = auVar269._0_8_;
          auVar216._0_8_ = dVar411;
          auVar269._8_8_ = auVar219._0_8_;
          auVar246 = divpd(auVar403,auVar269);
          auVar247 = divpd(auVar246,_DAT_010954a0);
          auVar289._8_8_ = dVar359 / auVar269._0_8_;
          auVar289._0_8_ = 0x3f55f15f15f15f16;
          auVar290._8_8_ = 0x47b9867eba1668be;
          auVar290._0_8_ = dVar411;
          auVar290 = divpd(auVar289,auVar290);
          auVar273._0_8_ = dVar378 * dVar411;
          auVar326._0_8_ = -dVar343;
          auVar326._8_8_ = dVar343;
          auVar328._8_8_ = dVar395;
          auVar328._0_8_ = auVar273._0_8_;
          auVar246 = divpd(auVar326,auVar328);
          auVar215 = divpd(auVar246,_DAT_01095490);
          dVar235 = dVar395 * auVar273._0_8_;
          auVar325._8_8_ = dVar343 / dVar235;
          auVar325._0_8_ = dVar359;
          auVar326 = divpd(auVar325,_DAT_010954b0);
          auVar331._8_8_ = 0x3ff0000000000000;
          auVar331._0_8_ = dVar359;
          auVar291._8_8_ = auVar219._0_8_;
          auVar291._0_8_ = dVar378;
          auVar327._8_8_ = 0x3ff0000000000000;
          auVar327._0_8_ = dVar359;
          auVar246 = divpd(auVar327,auVar291);
          auVar328 = divpd(auVar246,_DAT_010954d0);
          auVar268._8_8_ = 0x3ff0000000000000;
          auVar268._0_8_ = dVar359;
          auVar246 = divpd(auVar268,auVar216);
          auVar269 = divpd(auVar246,_DAT_010954e0);
          auVar273._8_8_ = dVar235;
          auVar217._8_8_ = 0x3ff0000000000000;
          auVar217._0_8_ = dVar359;
          auVar246 = divpd(auVar217,auVar273);
          auVar267 = divpd(auVar246,_DAT_010954f0);
          auVar294._0_8_ = dVar359 / dVar395;
          auVar294._8_8_ = dVar343;
          auVar246 = divpd(auVar294,_DAT_01095500);
          auVar166 = divpd(auVar331,auVar219);
          auVar166 = divpd(auVar166,_DAT_01095510);
          dVar235 = auVar166._8_8_ +
                    auVar246._8_8_ +
                    auVar267._8_8_ +
                    auVar269._8_8_ +
                    auVar328._8_8_ +
                    (1.0 / dVar395) * 3.804788961038961e-06 +
                    (1.0 / auVar273._0_8_) / -11520.0 +
                    auVar290._8_8_ + (dVar359 / dVar235) / -3.511556992918352e+39 + auVar290._0_8_ +
                    (dVar343 / dVar411) / 927028425523200.0 +
                    auVar166._0_8_ +
                    auVar246._0_8_ +
                    auVar267._0_8_ +
                    auVar269._0_8_ +
                    auVar328._0_8_ +
                    ((((auVar215._8_8_ + auVar215._0_8_) - auVar247._8_8_) + auVar247._0_8_) -
                    auVar326._8_8_) + auVar326._0_8_;
        }
        dVar154 = 1.0 / dVar47;
        dVar236 = dVar33 * dVar33 * 0.14417005510442776;
        dVar155 = dVar152 * 0.04229627833333333 +
                  local_ae8 * -0.14554132 * (dVar100 / dVar24) + dVar236;
        dVar47 = 1.0 / (dVar47 * dVar47);
        dVar156 = dVar35 * dVar47;
        dVar33 = 0.32;
        if (dVar30 <= 0.32) {
          dVar33 = dVar30;
        }
        dVar157 = dVar33 * dVar33;
        dVar50 = 1.0 / dVar157;
        dVar51 = exp(dVar50 * -0.25);
        dVar52 = erf((1.0 / dVar33) * 0.5);
        dVar244 = dVar30;
        if (dVar30 <= 0.32) {
          dVar244 = 0.32;
        }
        dVar379 = dVar244 * dVar244;
        dVar396 = dVar379 * dVar379;
        dVar412 = dVar396 * dVar396;
        dVar107 = dVar412 * dVar412;
        dVar262 = 1.0 / dVar107;
        auVar247._0_8_ = 1.0 / (dVar107 * dVar107);
        dVar318 = dVar33 * dVar157;
        dVar285 = dVar157 * dVar157;
        dVar237 = dVar33 * dVar285;
        dVar108 = dVar285 * dVar285;
        dVar421 = dVar33 * dVar108 * -122880.0 +
                  dVar285 * dVar318 * 3840.0 + dVar237 * -576.0 + dVar33 * -8.0 + dVar318 * 256.0;
        dVar238 = dVar157 * dVar285;
        dVar286 = dVar238 * 5120.0 + dVar285 * -1440.0 + dVar157 * 224.0 + -35.0;
        dVar448 = dVar157 * 60.0 + -2.0;
        dVar109 = dVar318 * 24.0;
        dVar107 = dVar421 * dVar51 + dVar448 * 3.5449077018110318 * dVar52 + dVar109 * dVar286;
        if (dVar30 < 0.32) {
          dVar206 = dVar33 * 1.1428571428571428 * dVar107 + 1.0;
        }
        else {
          dVar206 = dVar379 * dVar396;
          auVar167._8_8_ = dVar262 / dVar379;
          auVar167._0_8_ = dVar262;
          auVar126._8_8_ = dVar262;
          auVar126._0_8_ = dVar262;
          auVar78._8_8_ = dVar206;
          auVar78._0_8_ = dVar396;
          auVar218._8_8_ = dVar262;
          auVar218._0_8_ = dVar262;
          auVar270._8_8_ = dVar379 * dVar412;
          auVar270._0_8_ = dVar412;
          auVar248._8_8_ = dVar262;
          auVar248._0_8_ = dVar262;
          auVar267 = divpd(auVar248,auVar270);
          auVar292._0_8_ = dVar412 * dVar396;
          auVar292._8_8_ = dVar412 * dVar206;
          auVar246 = divpd(auVar126,auVar292);
          auVar166 = divpd(auVar167,_DAT_01095520);
          auVar215 = divpd(auVar218,auVar78);
          auVar219 = divpd(auVar215,_DAT_01095530);
          auVar269 = divpd(auVar267,_DAT_01095540);
          auVar246 = divpd(auVar246,_DAT_01095550);
          auVar247._8_8_ = auVar247._0_8_ / dVar379;
          auVar267 = divpd(auVar247,_DAT_01095560);
          auVar127._8_8_ = auVar247._0_8_;
          auVar127._0_8_ = auVar247._0_8_;
          auVar215 = divpd(auVar127,auVar78);
          auVar215 = divpd(auVar215,_DAT_01095570);
          dVar206 = ((((((((((((1.0 / auVar292._8_8_) / -115811942400.0 +
                               (1.0 / auVar292._0_8_) / 2530344960.0 +
                               (1.0 / (dVar379 * dVar412)) / -61501440.0 +
                               (1.0 / dVar412) * 5.871587902837903e-07 +
                               (1.0 / dVar206) / -56448.0 + 0.0003826530612244898 / dVar396 +
                              auVar166._0_8_) - auVar166._8_8_) + auVar219._0_8_) - auVar219._8_8_)
                          + auVar269._0_8_) - auVar269._8_8_) + auVar246._0_8_) - auVar246._8_8_) +
                      auVar267._0_8_) - auVar267._8_8_) + auVar215._0_8_) - auVar215._8_8_;
        }
        dVar239 = dVar34 * dVar206 * 1.8171205928321397;
        dVar207 = dVar152 * dVar47;
        dVar240 = dVar239 * 0.026329605555555555 * dVar207 +
                  local_848 * dVar154 + dVar155 * dVar235 * 0.43209876543209874 * dVar156;
        dVar53 = dVar29 * dVar46 * -0.36927938319101117;
        uVar17 = -(ulong)(dVar24 <= dVar77);
        dVar1 = p->dens_threshold;
        dVar55 = p->zeta_threshold;
        dVar316 = (double)(uVar11 & (ulong)dVar284 |
                          ~uVar11 & ((ulong)dVar316 & uVar12 | ~uVar12 & (ulong)(dVar97 * -dVar26)))
                  + 1.0;
        dVar54 = cbrt(dVar316);
        uVar11 = -(ulong)(dVar316 <= dVar55);
        dVar110 = __x_00 * __x_00;
        dVar55 = cbrt(__x_00);
        dVar158 = 1.0 / (dVar55 * dVar55);
        dVar159 = dVar158 / dVar110;
        dVar111 = local_c20 * dVar159;
        dVar208 = (1.0 / dVar55) / (__x_00 * dVar110 * dVar110);
        dVar56 = dVar101 * 0.002689949046226295 * local_c20 * local_c20 * dVar208 +
                 dVar38 * dVar111 + 1.0;
        dVar57 = pow(dVar56,0.1);
        dVar284 = (double)((ulong)dVar284 & uVar14 |
                          ~uVar14 & ((~uVar15 & (ulong)dVar233 | uVar15 & (ulong)dVar284) ^
                                    0x8000000000000000)) + 1.0;
        dVar233 = p->zeta_threshold;
        dVar58 = cbrt(dVar284);
        uVar18 = -(ulong)(dVar284 <= dVar233);
        dVar233 = (double)((ulong)dVar27 & uVar18 | ~uVar18 & (ulong)dVar58);
        auVar168._8_8_ = dVar233;
        auVar168._0_8_ = dVar57;
        auVar246 = divpd(_DAT_01025040,auVar168);
        dVar284 = auVar246._0_8_;
        dVar149 = auVar246._8_8_;
        dVar57 = (dVar102 * dVar284 * dVar149) / 18.0;
        dVar102 = 1e-10;
        if (1e-10 <= dVar57) {
          dVar102 = dVar57;
        }
        dVar112 = 1.35;
        if (dVar102 <= 1.35) {
          dVar112 = dVar102;
        }
        dVar59 = 1.0 / dVar112;
        dVar60 = erf(dVar59 * 0.5);
        dVar113 = dVar112 * dVar112;
        dVar61 = exp((1.0 / dVar113) * -0.25);
        dVar365 = dVar102;
        if (dVar102 <= 1.35) {
          dVar365 = 1.35;
        }
        dVar362 = dVar365 * dVar365;
        dVar380 = dVar362 * dVar362;
        dVar209 = dVar380 * dVar380;
        auVar128._0_8_ = dVar209 * dVar209;
        auVar128._8_8_ = dVar209;
        auVar246 = divpd(_DAT_01025040,auVar128);
        dVar209 = dVar113 * -2.0 * (dVar61 + -1.0) + dVar61 + -1.5;
        dVar60 = dVar60 * 1.7724538509055159 + (dVar112 + dVar112) * dVar209;
        local_408._8_8_ = auVar246._8_8_;
        local_408._0_8_ = local_408._8_8_;
        if (dVar102 < 1.35) {
          local_a38 = dVar112 * -2.6666666666666665 * dVar60 + 1.0;
        }
        else {
          auVar79._0_8_ = (double)local_408._8_8_ / (dVar362 * dVar380);
          auVar169._0_8_ = 1.0 / (dVar362 * dVar380);
          auVar129._8_8_ = dVar380;
          auVar129._0_8_ = dVar362;
          auVar215 = divpd(_DAT_01025040,auVar129);
          auVar219 = divpd(auVar215,_DAT_010339c0);
          auVar169._8_8_ = local_408._8_8_;
          auVar166 = divpd(auVar169,_DAT_010339d0);
          auVar220._8_8_ = local_408._8_8_;
          auVar220._0_8_ = local_408._8_8_;
          auVar215 = divpd(auVar220,auVar129);
          auVar267 = divpd(auVar215,_DAT_010339e0);
          auVar79._8_8_ = auVar246._0_8_;
          auVar215 = divpd(auVar79,_DAT_010339f0);
          local_a38 = ((((((auVar219._0_8_ - auVar219._8_8_) + auVar166._0_8_) - auVar166._8_8_) +
                        auVar267._0_8_) - auVar267._8_8_) + auVar215._0_8_) - auVar215._8_8_;
        }
        dVar316 = (double)(~uVar11 & (ulong)(dVar316 * dVar54) | (ulong)(dVar25 * dVar27) & uVar11);
        local_198 = (uint)uVar17;
        uStack_194 = (uint)(uVar17 >> 0x20);
        local_9b8 = SUB84(dVar53 * dVar240,0);
        uStack_9b4 = (uint)((ulong)(dVar53 * dVar240) >> 0x20);
        local_688 = (double)CONCAT44(~uStack_194 & uStack_9b4,~local_198 & local_9b8);
        dVar62 = pow(dVar56,0.2);
        dVar27 = 0.27;
        if (dVar102 <= 0.27) {
          dVar27 = dVar102;
        }
        dVar114 = dVar27 * dVar27;
        dVar63 = exp((-1.0 / dVar114) * 0.25);
        dVar64 = erf((1.0 / dVar27) * 0.5);
        dVar124 = dVar102;
        if (dVar102 <= 0.27) {
          dVar124 = 0.27;
        }
        dVar381 = dVar124 * dVar124;
        dVar413 = dVar381 * dVar381;
        dVar397 = dVar413 * dVar413;
        dVar287 = dVar397 * dVar397;
        auVar130._8_8_ = dVar287 * dVar287;
        auVar130._0_8_ = dVar287;
        auVar215 = divpd(_DAT_01025040,auVar130);
        dVar210 = dVar114 * dVar114 * 64.0;
        dVar160 = dVar114 * 20.0 - dVar210;
        dVar210 = dVar114 * -36.0 + dVar27 * 17.724538509055158 * dVar64 + dVar160 * dVar63 +
                  dVar210 + -3.0;
        local_608._8_8_ = auVar215._0_8_;
        dVar214 = auVar215._8_8_;
        local_608._0_8_ = local_608._8_8_;
        if (dVar102 < 0.27) {
          dVar241 = dVar114 * 24.0 * dVar210 + 1.0;
        }
        else {
          auVar80._0_8_ = dVar397 * dVar381;
          auVar80._8_8_ = dVar287 * dVar381;
          auVar131._0_8_ = dVar413 * dVar397;
          auVar221._8_8_ = auVar131._0_8_;
          auVar221._0_8_ = dVar413;
          auVar131._8_8_ = auVar80._0_8_;
          auVar249._8_8_ = local_608._8_8_;
          auVar249._0_8_ = local_608._8_8_;
          auVar166 = divpd(auVar249,auVar131);
          auVar290 = divpd(auVar166,_DAT_010954a0);
          auVar293._8_8_ = dVar214 / auVar131._0_8_;
          auVar293._0_8_ = 0x3f55f15f15f15f16;
          auVar132._8_8_ = 0x47b9867eba1668be;
          auVar132._0_8_ = dVar413;
          auVar294 = divpd(auVar293,auVar132);
          auVar133._0_8_ = dVar381 * dVar413;
          auVar170._0_8_ = -(double)local_608._8_8_;
          auVar170._8_8_ = local_608._8_8_;
          auVar271._8_8_ = dVar397;
          auVar271._0_8_ = auVar133._0_8_;
          auVar166 = divpd(auVar170,auVar271);
          auVar267 = divpd(auVar166,_DAT_01095490);
          dVar241 = dVar397 * auVar133._0_8_;
          auVar329._8_8_ = (double)local_608._8_8_ / dVar241;
          auVar329._0_8_ = dVar214;
          auVar326 = divpd(auVar329,_DAT_010954b0);
          auVar171._8_8_ = 0x3ff0000000000000;
          auVar171._0_8_ = dVar214;
          auVar295._8_8_ = auVar80._0_8_;
          auVar295._0_8_ = dVar381;
          auVar330._8_8_ = 0x3ff0000000000000;
          auVar330._0_8_ = dVar214;
          auVar166 = divpd(auVar330,auVar295);
          auVar331 = divpd(auVar166,_DAT_010954d0);
          auVar272._8_8_ = 0x3ff0000000000000;
          auVar272._0_8_ = dVar214;
          auVar166 = divpd(auVar272,auVar221);
          auVar273 = divpd(auVar166,_DAT_010954e0);
          auVar133._8_8_ = dVar241;
          auVar222._8_8_ = 0x3ff0000000000000;
          auVar222._0_8_ = dVar214;
          auVar166 = divpd(auVar222,auVar133);
          auVar269 = divpd(auVar166,_DAT_010954f0);
          auVar134._0_8_ = dVar214 / dVar397;
          auVar134._8_8_ = local_608._8_8_;
          auVar166 = divpd(auVar134,_DAT_01095500);
          auVar219 = divpd(auVar171,auVar80);
          auVar219 = divpd(auVar219,_DAT_01095510);
          dVar241 = auVar219._8_8_ +
                    auVar166._8_8_ +
                    auVar269._8_8_ +
                    auVar273._8_8_ +
                    auVar331._8_8_ +
                    (1.0 / dVar397) * 3.804788961038961e-06 +
                    (1.0 / auVar133._0_8_) / -11520.0 +
                    auVar294._8_8_ + (dVar214 / dVar241) / -3.511556992918352e+39 + auVar294._0_8_ +
                    ((double)local_608._8_8_ / dVar413) / 927028425523200.0 +
                    auVar219._0_8_ +
                    auVar166._0_8_ +
                    auVar269._0_8_ +
                    auVar273._0_8_ +
                    auVar331._0_8_ +
                    ((((auVar267._8_8_ + auVar267._0_8_) - auVar290._8_8_) + auVar290._0_8_) -
                    auVar326._8_8_) + auVar326._0_8_;
        }
        dVar211 = 1.0 / dVar62;
        dVar161 = dVar111 * 0.04229627833333333 +
                  local_af0 * -0.14554132 * (dVar158 / __x_00) + dVar236;
        dVar62 = 1.0 / (dVar62 * dVar62);
        dVar162 = dVar35 * dVar62;
        dVar236 = 0.32;
        if (dVar102 <= 0.32) {
          dVar236 = dVar102;
        }
        dVar163 = dVar236 * dVar236;
        dVar65 = 1.0 / dVar163;
        dVar66 = exp(dVar65 * -0.25);
        dVar67 = erf((1.0 / dVar236) * 0.5);
        dVar75 = dVar102;
        if (dVar102 <= 0.32) {
          dVar75 = 0.32;
        }
        dVar398 = dVar75 * dVar75;
        dVar414 = dVar398 * dVar398;
        dVar422 = dVar414 * dVar414;
        dVar115 = dVar422 * dVar422;
        dVar437 = 1.0 / dVar115;
        dVar212 = 1.0 / (dVar115 * dVar115);
        dVar363 = dVar236 * dVar163;
        dVar344 = dVar163 * dVar163;
        dVar319 = dVar236 * dVar344;
        dVar116 = dVar344 * dVar344;
        dVar382 = dVar236 * dVar116 * -122880.0 +
                  dVar344 * dVar363 * 3840.0 + dVar319 * -576.0 + dVar236 * -8.0 + dVar363 * 256.0;
        dVar320 = dVar163 * dVar344;
        dVar321 = dVar320 * 5120.0 + dVar344 * -1440.0 + dVar163 * 224.0 + -35.0;
        dVar449 = dVar163 * 60.0 + -2.0;
        dVar117 = dVar363 * 24.0;
        dVar115 = dVar382 * dVar66 + dVar449 * 3.5449077018110318 * dVar67 + dVar117 * dVar321;
        if (dVar102 < 0.32) {
          dVar263 = dVar236 * 1.1428571428571428 * dVar115 + 1.0;
        }
        else {
          dVar263 = dVar398 * dVar414;
          auVar250._8_8_ = dVar437 / dVar398;
          auVar250._0_8_ = dVar437;
          auVar135._8_8_ = dVar437;
          auVar135._0_8_ = dVar437;
          auVar81._8_8_ = dVar263;
          auVar81._0_8_ = dVar414;
          auVar274._8_8_ = dVar437;
          auVar274._0_8_ = dVar437;
          auVar346._8_8_ = dVar398 * dVar422;
          auVar346._0_8_ = dVar422;
          auVar332._8_8_ = dVar437;
          auVar332._0_8_ = dVar437;
          auVar269 = divpd(auVar332,auVar346);
          auVar367._0_8_ = dVar422 * dVar414;
          auVar367._8_8_ = dVar422 * dVar263;
          auVar166 = divpd(auVar135,auVar367);
          auVar219 = divpd(auVar250,_DAT_01095520);
          auVar267 = divpd(auVar274,auVar81);
          auVar290 = divpd(auVar267,_DAT_01095530);
          auVar273 = divpd(auVar269,_DAT_01095540);
          auVar166 = divpd(auVar166,_DAT_01095550);
          auVar251._8_8_ = dVar212 / dVar398;
          auVar251._0_8_ = dVar212;
          auVar269 = divpd(auVar251,_DAT_01095560);
          auVar136._8_8_ = dVar212;
          auVar136._0_8_ = dVar212;
          auVar267 = divpd(auVar136,auVar81);
          auVar267 = divpd(auVar267,_DAT_01095570);
          dVar263 = ((((((((((((1.0 / auVar367._8_8_) / -115811942400.0 +
                               (1.0 / auVar367._0_8_) / 2530344960.0 +
                               (1.0 / (dVar398 * dVar422)) / -61501440.0 +
                               (1.0 / dVar422) * 5.871587902837903e-07 +
                               (1.0 / dVar263) / -56448.0 + 0.0003826530612244898 / dVar414 +
                              auVar219._0_8_) - auVar219._8_8_) + auVar290._0_8_) - auVar290._8_8_)
                          + auVar273._0_8_) - auVar273._8_8_) + auVar166._0_8_) - auVar166._8_8_) +
                      auVar269._0_8_) - auVar269._8_8_) + auVar267._0_8_) - auVar267._8_8_;
        }
        dVar242 = dVar34 * dVar263 * 1.8171205928321397;
        dVar213 = dVar111 * dVar62;
        dVar243 = dVar242 * 0.026329605555555555 * dVar213 +
                  local_a38 * dVar211 + dVar161 * dVar241 * 0.43209876543209874 * dVar162;
        dVar68 = dVar29 * dVar316 * -0.36927938319101117;
        local_688 = local_688 + (double)(~-(ulong)(__x_00 <= dVar1) & (ulong)(dVar68 * dVar243));
        pdVar4 = out->zk;
        if ((pdVar4 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar7 = (long)(p->dim).zk * sVar9;
          pdVar4[lVar7] = pdVar4[lVar7] + local_688;
        }
        dVar118 = 1.0 / (__x * __x);
        dVar69 = dVar26 * dVar118;
        dVar119 = dVar97 - dVar69;
        bVar5 = dVar25 < dVar150;
        bVar6 = dVar25 < dVar203;
        local_c08 = 0.0;
        dVar203 = 0.0;
        if (bVar6 && bVar5) {
          dVar203 = dVar119;
        }
        dVar164 = 1.0 / (dVar29 * dVar29);
        dVar98 = (dVar32 / __x) * 1.4422495703074083 * dVar98;
        dVar31 = dVar31 * p->cam_omega * 1.4422495703074083;
        dVar165 = dVar164 * dVar46 * 0.9847450218426964 * dVar240 * 0.125;
        dVar342 = dVar342 * dVar71;
        dVar70 = (dVar40 * dVar148 * dVar98) / 54.0;
        dVar120 = (dVar100 / (dVar24 * dVar99)) * local_b70;
        dVar99 = dVar35 * -0.40121303703703703 * dVar120 +
                 local_b70 * local_b70 * dVar101 * -0.014346394913206906 *
                 ((1.0 / dVar36) / (dVar99 * dVar99 * dVar99));
        dVar41 = 1.0 / (dVar41 * dVar41);
        dVar42 = 1.0 / (dVar42 * dVar42);
        dVar36 = (dVar40 / dVar39) * dVar32;
        if (1e-10 <= dVar103) {
          local_c08 = (dVar40 * dVar32 * dVar31 *
                      (double)(~uVar16 &
                              (ulong)(((double)(~uVar15 & ~uVar14 & (ulong)dVar119) * dVar42) / 3.0)
                              ) * dVar41) / -18.0 +
                      ((dVar36 * dVar31 * dVar99 * dVar148) / -180.0 - dVar70);
        }
        dVar264 = 1.0 / dVar342;
        auVar82._0_8_ = dVar71 * dVar361;
        auVar172._8_8_ = dVar361 * dVar342;
        auVar172._0_8_ = dVar71;
        dVar361 = 1.0 / auVar82._0_8_;
        auVar82._8_8_ = dVar342;
        auVar417 = divpd(auVar417,auVar82);
        auVar443._8_8_ = 0x3ff0000000000000;
        auVar443._0_8_ = dVar314;
        auVar166 = divpd(auVar443,auVar172);
        dVar446 = auVar166._8_8_;
        auVar125 = divpd(auVar125,auVar172);
        dVar342 = (1.0 / dVar105) * dVar45;
        dVar71 = 1.0 / (dVar105 * dVar104);
        dVar105 = (dVar45 + -1.0) * dVar104 * -4.0;
        dVar317 = dVar317 + dVar317;
        uVar19 = -(ulong)(1.35 < dVar30);
        dVar420 = auVar417._8_8_;
        dVar434 = auVar125._8_8_;
        dVar438 = auVar166._0_8_;
        dVar314 = auVar417._0_8_;
        dVar423 = auVar125._0_8_;
        if (dVar30 < 1.35) {
          dVar72 = (double)(~uVar19 & (ulong)local_c08);
          local_808 = dVar72 * -2.6666666666666665 * dVar44 +
                      dVar104 * -2.6666666666666665 *
                      ((((dVar105 * dVar72 + dVar71 * dVar72 * dVar45 * 0.5) -
                        dVar72 * dVar43 * dVar45) * dVar205 + dVar317 * dVar72) - dVar72 * dVar342);
        }
        else {
          dVar72 = (double)(uVar19 & (ulong)local_c08);
          auVar333._0_8_ = -dVar264 * dVar72;
          auVar333._8_8_ = dVar361 * dVar72;
          auVar417 = divpd(auVar333,_DAT_01033a00);
          auVar444._0_8_ = dVar438 * dVar72;
          auVar444._8_8_ = dVar446 * dVar72;
          auVar267 = divpd(auVar444,_DAT_01033a10);
          auVar334._0_8_ = dVar314 * dVar72;
          auVar334._8_8_ = dVar420 * dVar72;
          auVar166 = divpd(auVar334,_DAT_01033a20);
          auVar83._0_8_ = dVar72 * dVar423;
          auVar83._8_8_ = dVar72 * dVar434;
          auVar125 = divpd(auVar83,_DAT_01033a30);
          local_808 = ((((((auVar417._8_8_ + auVar417._0_8_) - auVar267._8_8_) + auVar267._0_8_) -
                        auVar166._8_8_) + auVar166._0_8_) - auVar125._8_8_) + auVar125._0_8_;
        }
        auVar137._0_8_ = dVar261 * dVar121;
        auVar137._8_8_ = dVar411 * dVar121;
        auVar335._0_8_ = dVar395 * auVar137._8_8_;
        dVar72 = dVar359 / auVar335._0_8_;
        dVar378 = dVar378 * dVar121;
        auVar84._0_8_ = dVar378 * dVar411;
        auVar84._8_8_ = dVar121 * dVar395;
        dVar261 = 1.0 / auVar84._8_8_;
        auVar347._8_8_ = auVar84._0_8_;
        auVar347._0_8_ = dVar378;
        auVar252._0_8_ = dVar395 * dVar378;
        auVar252._8_8_ = dVar395 * auVar84._0_8_;
        dVar395 = dVar359 / auVar252._8_8_;
        auVar368._8_8_ = auVar335._0_8_;
        auVar368._0_8_ = auVar252._0_8_;
        auVar417 = divpd(auVar403,auVar368);
        auVar402._8_8_ = dVar359;
        auVar402._0_8_ = 0x3ff0000000000000;
        auVar335._8_8_ = dVar121;
        auVar223._8_8_ = dVar359;
        auVar223._0_8_ = 0x3ff0000000000000;
        auVar166 = divpd(auVar223,auVar335);
        auVar275._8_8_ = dVar343;
        auVar275._0_8_ = 0x3ff0000000000000;
        auVar267 = divpd(auVar275,auVar252);
        dVar415 = dVar359 / auVar252._0_8_;
        auVar253._8_8_ = dVar378;
        auVar253._0_8_ = auVar252._8_8_;
        auVar418._8_8_ = dVar359;
        auVar418._0_8_ = 0x3ff0000000000000;
        auVar219 = divpd(auVar418,auVar253);
        auVar125 = divpd(auVar266,auVar347);
        dVar378 = 1.0 / auVar84._0_8_;
        dVar450 = (1.0 / auVar137._8_8_) * -0.005357142857142857;
        auVar269 = divpd(auVar403,auVar84);
        dVar447 = auVar269._8_8_;
        auVar403 = divpd(auVar402,auVar137);
        dVar410 = auVar403._8_8_;
        auVar85._8_8_ = auVar84._8_8_;
        auVar85._0_8_ = auVar137._8_8_;
        auVar266 = divpd(auVar266,auVar85);
        dVar234 = dVar234 * dVar151;
        dVar411 = dVar151 * dVar106 * 256.0;
        dVar153 = (1.0 / (dVar151 * dVar106)) * dVar153;
        dVar121 = (1.0 / dVar151) * dVar48 * -10.0;
        uVar20 = -(ulong)(0.27 < dVar30);
        dVar359 = auVar267._8_8_;
        local_5e8 = auVar417._0_8_;
        dStack_5e0 = auVar417._8_8_;
        local_6c8 = auVar166._0_8_;
        dStack_6c0 = auVar166._8_8_;
        local_6d8 = auVar219._0_8_;
        dStack_6d0 = auVar219._8_8_;
        local_6b8 = auVar125._0_8_;
        dStack_6b0 = auVar125._8_8_;
        local_5b8 = auVar266._0_8_;
        dStack_5b0 = auVar266._8_8_;
        dVar439 = auVar269._0_8_;
        dVar399 = auVar403._0_8_;
        dVar343 = auVar267._0_8_;
        if (dVar30 < 0.27) {
          dVar322 = (double)(~uVar20 & (ulong)local_c08);
          local_818 = dVar234 * 48.0 * dVar322 +
                      dVar106 * 24.0 *
                      (dVar121 * dVar322 +
                      dVar322 * 10.0 * 1.7724538509055159 * dVar49 +
                      dVar151 * dVar322 * -72.0 +
                      (dVar151 * dVar322 * 40.0 - dVar411 * dVar322) * dVar48 +
                      dVar48 * dVar322 * dVar153 * 0.5 + dVar411 * dVar322);
        }
        else {
          dVar322 = (double)(uVar20 & (ulong)local_c08);
          auVar427._0_8_ = dVar439 * dVar322;
          auVar427._8_8_ = dVar447 * dVar322;
          auVar269 = divpd(auVar427,_DAT_010955b0);
          auVar445._0_8_ = local_5e8 * dVar322;
          auVar445._8_8_ = dStack_5e0 * dVar322;
          auVar290 = divpd(auVar445,_DAT_010955c0);
          auVar138._0_8_ = -dVar72 * dVar322;
          auVar138._8_8_ = dVar395 * dVar322;
          auVar125 = divpd(auVar138,_DAT_010955d0);
          auVar276._0_8_ = dVar343 * dVar322;
          auVar276._8_8_ = dVar359 * dVar322;
          auVar166 = divpd(auVar276,_DAT_010955e0);
          auVar348._0_8_ = local_6c8 * dVar322;
          auVar348._8_8_ = dStack_6c0 * dVar322;
          auVar403 = divpd(auVar348,_DAT_010955f0);
          auVar139._0_8_ = local_6d8 * dVar322;
          auVar139._8_8_ = dStack_6d0 * dVar322;
          auVar266 = divpd(auVar139,_DAT_01095600);
          auVar404._0_8_ = dVar399 * dVar322;
          auVar404._8_8_ = dVar410 * dVar322;
          auVar219 = divpd(auVar404,_DAT_01095610);
          auVar140._0_8_ = local_6b8 * dVar322;
          auVar140._8_8_ = dStack_6b0 * dVar322;
          auVar417 = divpd(auVar140,_DAT_01095620);
          auVar336._0_8_ = dVar322 * local_5b8;
          auVar336._8_8_ = dVar322 * dStack_5b0;
          auVar267 = divpd(auVar336,_DAT_01095630);
          local_818 = auVar267._8_8_ +
                      auVar417._8_8_ +
                      auVar219._8_8_ +
                      auVar266._8_8_ +
                      auVar403._8_8_ +
                      auVar166._8_8_ +
                      (((auVar269._0_8_ - auVar269._8_8_) + auVar290._0_8_) - auVar290._8_8_) +
                      (dVar415 * dVar322) / 8.121312287389663e+33 +
                      auVar267._0_8_ +
                      auVar417._0_8_ +
                      auVar219._0_8_ +
                      auVar266._0_8_ +
                      auVar403._0_8_ +
                      auVar166._0_8_ +
                      dVar261 * -3.0438311688311688e-05 * dVar322 +
                      (dVar378 * dVar322) / 1920.0 +
                      dVar450 * dVar322 + auVar125._8_8_ + auVar125._0_8_;
        }
        auVar337._0_8_ = dVar379 * dVar244;
        auVar337._8_8_ = dVar244;
        auVar386._0_8_ = dVar396 * auVar337._0_8_;
        auVar386._8_8_ = dVar396 * dVar244;
        dVar379 = 1.0 / auVar386._0_8_;
        auVar86._0_8_ = auVar337._0_8_ * dVar412;
        auVar86._8_8_ = dVar244 * dVar412;
        dVar244 = 1.0 / auVar86._0_8_;
        auVar454._8_8_ = dVar262;
        auVar454._0_8_ = dVar262;
        auVar254._8_8_ = dVar262;
        auVar254._0_8_ = dVar262;
        auVar417 = divpd(auVar254,auVar86);
        dVar396 = auVar417._8_8_;
        dVar364 = 1.0 / auVar86._8_8_;
        auVar296._0_8_ = dVar412 * auVar386._0_8_;
        auVar296._8_8_ = dVar412 * auVar386._8_8_;
        dVar440 = 1.0 / auVar296._8_8_;
        dVar412 = 1.0 / auVar296._0_8_;
        auVar87._8_8_ = dVar262;
        auVar87._0_8_ = dVar262;
        auVar125 = divpd(auVar87,auVar337);
        auVar88._8_8_ = dVar262;
        auVar88._0_8_ = dVar262;
        auVar266 = divpd(auVar88,auVar386);
        auVar403 = divpd(auVar454,auVar296);
        dVar460 = auVar403._8_8_;
        auVar349._8_8_ = auVar247._0_8_;
        auVar349._0_8_ = auVar247._0_8_;
        auVar297._8_8_ = auVar247._0_8_;
        auVar297._0_8_ = auVar247._0_8_;
        auVar166 = divpd(auVar297,auVar337);
        dVar322 = auVar166._8_8_;
        auVar267 = divpd(auVar349,auVar386);
        dVar400 = (1.0 / auVar386._8_8_) * -0.001530612244897959;
        dVar421 = (1.0 / dVar318) * dVar421;
        dVar383 = dVar286 * dVar157 * 72.0;
        dVar323 = dVar33 * 1.7724538509055159 * 240.0;
        dVar424 = dVar448 * dVar51 * -2.0;
        uVar21 = -(ulong)(0.32 < dVar30);
        dVar360 = auVar267._8_8_;
        local_378 = auVar125._0_8_;
        dStack_370 = auVar125._8_8_;
        local_368 = auVar266._0_8_;
        dStack_360 = auVar266._8_8_;
        dVar448 = auVar267._0_8_;
        dVar262 = auVar417._0_8_;
        dVar451 = auVar403._0_8_;
        dVar286 = auVar166._0_8_;
        if (dVar30 < 0.32) {
          local_c08 = (double)(~uVar21 & (ulong)local_c08);
          dVar73 = local_c08 * 1.1428571428571428 * dVar107 +
                   dVar33 * 1.1428571428571428 *
                   (dVar50 * local_c08 * dVar424 +
                   dVar323 * local_c08 * dVar52 +
                   (dVar237 * local_c08 * 30720.0 +
                   dVar33 * local_c08 * 448.0 + dVar318 * local_c08 * -5760.0) * dVar109 +
                   dVar383 * local_c08 +
                   (dVar157 * local_c08 * 768.0 +
                   local_c08 * -8.0 +
                   dVar285 * local_c08 * -2880.0 +
                   dVar108 * -1105920.0 * local_c08 + dVar238 * 26880.0 * local_c08) * dVar51 +
                   dVar51 * local_c08 * dVar421 * 0.5);
        }
        else {
          local_c08 = (double)((ulong)local_c08 & uVar21);
          auVar141._0_8_ = local_378 * local_c08;
          auVar141._8_8_ = dStack_370 * local_c08;
          auVar125 = divpd(auVar141,_DAT_01095640);
          auVar142._0_8_ = local_368 * local_c08;
          auVar142._8_8_ = dStack_360 * local_c08;
          auVar266 = divpd(auVar142,_DAT_01095650);
          auVar255._0_8_ = dVar262 * local_c08;
          auVar255._8_8_ = dVar396 * local_c08;
          auVar166 = divpd(auVar255,_DAT_01095660);
          auVar455._0_8_ = dVar451 * local_c08;
          auVar455._8_8_ = dVar460 * local_c08;
          auVar403 = divpd(auVar455,_DAT_01095670);
          auVar298._0_8_ = dVar286 * local_c08;
          auVar298._8_8_ = dVar322 * local_c08;
          auVar267 = divpd(auVar298,_DAT_01095680);
          auVar173._0_8_ = local_c08 * dVar448;
          auVar173._8_8_ = local_c08 * dVar360;
          auVar417 = divpd(auVar173,_DAT_01095690);
          dVar73 = (((((((((((((local_c08 * dVar412) / 8272281600.0 +
                              (dVar440 * local_c08) / -210862080.0 +
                              (dVar244 * local_c08) / 6150144.0 +
                              dVar364 * -4.6972703222703225e-06 * local_c08 +
                              dVar400 * local_c08 + (dVar379 * local_c08) / 9408.0) - auVar125._8_8_
                             ) + auVar125._0_8_) - auVar266._8_8_) + auVar266._0_8_) -
                         auVar166._8_8_) + auVar166._0_8_) - auVar403._8_8_) + auVar403._0_8_) -
                     auVar267._8_8_) + auVar267._0_8_) - auVar417._8_8_) + auVar417._0_8_;
        }
        local_848 = local_848 * (dVar154 / dVar39);
        dVar39 = dVar47 / dVar39;
        dVar122 = dVar155 * dVar235 * 1.8171205928321397 * -0.1728395061728395;
        local_258 = 0.0;
        local_268 = 0.0;
        if (dVar77 < dVar24) {
          local_268 = (dVar99 * dVar39 * dVar152 * dVar239 * -0.010531842222222223 +
                      dVar73 * 1.8171205928321397 * dVar34 * 0.026329605555555555 * dVar207 +
                      dVar99 * dVar34 * dVar39 * dVar122 +
                      (local_ae8 * 0.24256886666666666 * dVar37 + dVar120 * -0.11279007555555555) *
                      dVar235 * 0.43209876543209874 * dVar156 +
                      local_818 * dVar155 * 0.43209876543209874 * dVar156 +
                      local_808 * dVar154 + (dVar99 * local_848) / -5.0 +
                      dVar120 * dVar47 * dVar239 * -0.07021228148148148) * dVar53 +
                      ((double)(~uVar13 & (ulong)(dVar203 * dVar28 * 1.3333333333333333)) * dVar29 *
                       -0.36927938319101117 * dVar240 - dVar165);
        }
        dVar118 = dVar118 * -dVar26;
        if (dVar25 < dVar150) {
          local_258 = (double)(~uVar12 & (ulong)(-dVar97 - dVar118));
        }
        dVar25 = dVar164 * dVar316 * 0.9847450218426964 * dVar243 * 0.125;
        dVar362 = dVar362 * dVar365;
        dVar98 = (dVar98 * dVar284 * dVar149) / 54.0;
        dVar99 = 1.0 / (dVar233 * dVar233);
        dVar150 = 1.0 / (dVar58 * dVar58);
        dVar26 = 0.0;
        if (1e-10 <= dVar57) {
          dVar26 = (dVar32 * dVar284 * dVar31 *
                   (double)(~uVar18 &
                           (ulong)(((double)(~uVar14 & ~uVar15 & (ulong)-dVar119) * dVar150) / 3.0))
                   * dVar99) / -18.0 - dVar98;
        }
        dVar58 = 1.0 / dVar362;
        auVar89._0_8_ = dVar365 * dVar380;
        auVar405._8_8_ = dVar380 * dVar362;
        auVar405._0_8_ = dVar365;
        dVar120 = 1.0 / auVar89._0_8_;
        auVar89._8_8_ = dVar362;
        auVar266 = divpd(local_408._0_16_,auVar89);
        auVar456._8_8_ = 0x3ff0000000000000;
        auVar456._0_8_ = local_408._8_8_;
        auVar417 = divpd(auVar456,auVar405);
        dVar73 = auVar417._8_8_;
        auVar125 = divpd(auVar246,auVar405);
        dVar380 = (1.0 / dVar113) * dVar61;
        dVar362 = 1.0 / (dVar113 * dVar112);
        dVar119 = (dVar61 + -1.0) * dVar112 * -4.0;
        uVar12 = -(ulong)(1.35 < dVar102);
        dVar113 = auVar266._8_8_;
        dVar233 = auVar125._8_8_;
        dVar164 = auVar417._0_8_;
        dVar365 = auVar266._0_8_;
        dVar203 = auVar125._0_8_;
        if (dVar102 < 1.35) {
          dVar123 = (double)(~uVar12 & (ulong)dVar26);
          dVar74 = (dVar119 * dVar123 + dVar362 * dVar123 * dVar61 * 0.5) -
                   dVar123 * dVar59 * dVar61;
          dVar74 = dVar112 * -2.6666666666666665 *
                   ((dVar74 + dVar74) * dVar112 +
                   ((dVar123 + dVar123) * dVar209 - dVar123 * dVar380));
          dVar123 = dVar123 * -2.6666666666666665 * dVar60;
        }
        else {
          dVar74 = (double)(uVar12 & (ulong)dVar26);
          auVar256._0_8_ = -dVar58 * dVar74;
          auVar256._8_8_ = dVar120 * dVar74;
          auVar266 = divpd(auVar256,_DAT_01033a00);
          auVar457._0_8_ = dVar164 * dVar74;
          auVar457._8_8_ = dVar73 * dVar74;
          auVar246 = divpd(auVar457,_DAT_01033a10);
          auVar257._0_8_ = dVar365 * dVar74;
          auVar257._8_8_ = dVar113 * dVar74;
          auVar417 = divpd(auVar257,_DAT_01033a20);
          auVar90._0_8_ = dVar74 * dVar203;
          auVar90._8_8_ = dVar74 * dVar233;
          auVar125 = divpd(auVar90,_DAT_01033a30);
          dVar74 = auVar125._0_8_;
          dVar123 = (((((auVar266._8_8_ + auVar266._0_8_) - auVar246._8_8_) + auVar246._0_8_) -
                     auVar417._8_8_) + auVar417._0_8_) - auVar125._8_8_;
        }
        auVar174._0_8_ = dVar287 * dVar124;
        auVar174._8_8_ = dVar413 * dVar124;
        auVar428._0_8_ = dVar397 * auVar174._8_8_;
        dVar287 = dVar214 / auVar428._0_8_;
        dVar381 = dVar381 * dVar124;
        auVar91._0_8_ = dVar381 * dVar413;
        auVar91._8_8_ = dVar124 * dVar397;
        dVar416 = 1.0 / auVar91._8_8_;
        auVar350._8_8_ = auVar91._0_8_;
        auVar350._0_8_ = dVar381;
        auVar258._0_8_ = dVar397 * dVar381;
        auVar258._8_8_ = dVar397 * auVar91._0_8_;
        dVar413 = dVar214 / auVar258._8_8_;
        auVar369._8_8_ = auVar428._0_8_;
        auVar369._0_8_ = auVar258._0_8_;
        auVar266 = divpd(local_608._0_16_,auVar369);
        auVar299._8_8_ = dVar214;
        auVar299._0_8_ = 0x3ff0000000000000;
        auVar428._8_8_ = dVar124;
        auVar277._8_8_ = dVar214;
        auVar277._0_8_ = 0x3ff0000000000000;
        auVar125 = divpd(auVar277,auVar428);
        dVar397 = auVar125._8_8_;
        auVar429._8_8_ = local_608._8_8_;
        auVar429._0_8_ = 0x3ff0000000000000;
        auVar403 = divpd(auVar429,auVar258);
        dVar452 = dVar214 / auVar258._0_8_;
        auVar259._8_8_ = dVar381;
        auVar259._0_8_ = auVar258._8_8_;
        auVar370._8_8_ = dVar214;
        auVar370._0_8_ = 0x3ff0000000000000;
        auVar166 = divpd(auVar370,auVar259);
        auVar267 = divpd(auVar215,auVar350);
        dVar441 = 1.0 / auVar91._0_8_;
        dVar124 = (1.0 / auVar174._8_8_) * -0.005357142857142857;
        auVar246 = divpd(local_608._0_16_,auVar91);
        auVar417 = divpd(auVar299,auVar174);
        auVar92._8_8_ = auVar91._8_8_;
        auVar92._0_8_ = auVar174._8_8_;
        auVar215 = divpd(auVar215,auVar92);
        dVar210 = dVar210 * dVar27;
        dVar345 = dVar27 * dVar114 * 256.0;
        dVar160 = (1.0 / (dVar27 * dVar114)) * dVar160;
        dVar214 = (1.0 / dVar27) * dVar63 * -10.0;
        uVar22 = -(ulong)(0.27 < dVar102);
        dVar341 = auVar246._8_8_;
        dVar435 = auVar403._8_8_;
        dVar315 = auVar417._8_8_;
        dVar393 = auVar215._8_8_;
        local_608._0_8_ = auVar266._0_8_;
        local_608._8_8_ = auVar266._8_8_;
        local_738 = auVar166._0_8_;
        dStack_730 = auVar166._8_8_;
        local_b48 = auVar267._0_8_;
        dStack_b40 = auVar267._8_8_;
        dVar324 = auVar246._0_8_;
        dVar381 = auVar125._0_8_;
        dVar425 = auVar403._0_8_;
        dVar288 = auVar417._0_8_;
        dVar384 = auVar215._0_8_;
        if (dVar102 < 0.27) {
          dVar245 = (double)(~uVar22 & (ulong)dVar26);
          dVar245 = dVar210 * 48.0 * dVar245 +
                    (dVar214 * dVar245 +
                    dVar245 * 10.0 * 1.7724538509055159 * dVar64 +
                    dVar27 * dVar245 * -72.0 +
                    (dVar27 * dVar245 * 40.0 - dVar345 * dVar245) * dVar63 +
                    dVar63 * dVar245 * dVar160 * 0.5 + dVar345 * dVar245) * 24.0 * dVar114;
        }
        else {
          dVar245 = (double)(uVar22 & (ulong)dVar26);
          auVar338._0_8_ = dVar324 * dVar245;
          auVar338._8_8_ = dVar341 * dVar245;
          auVar267 = divpd(auVar338,_DAT_010955b0);
          auVar458._0_8_ = (double)local_608._0_8_ * dVar245;
          auVar458._8_8_ = (double)local_608._8_8_ * dVar245;
          auVar219 = divpd(auVar458,_DAT_010955c0);
          auVar224._0_8_ = -dVar287 * dVar245;
          auVar224._8_8_ = dVar413 * dVar245;
          auVar125 = divpd(auVar224,_DAT_010955d0);
          auVar430._0_8_ = dVar425 * dVar245;
          auVar430._8_8_ = dVar435 * dVar245;
          auVar403 = divpd(auVar430,_DAT_010955e0);
          auVar278._0_8_ = dVar381 * dVar245;
          auVar278._8_8_ = dVar397 * dVar245;
          auVar215 = divpd(auVar278,_DAT_010955f0);
          auVar225._0_8_ = local_738 * dVar245;
          auVar225._8_8_ = dStack_730 * dVar245;
          auVar266 = divpd(auVar225,_DAT_01095600);
          auVar300._0_8_ = dVar288 * dVar245;
          auVar300._8_8_ = dVar315 * dVar245;
          auVar166 = divpd(auVar300,_DAT_01095610);
          auVar226._0_8_ = local_b48 * dVar245;
          auVar226._8_8_ = dStack_b40 * dVar245;
          auVar417 = divpd(auVar226,_DAT_01095620);
          auVar260._0_8_ = dVar245 * dVar384;
          auVar260._8_8_ = dVar245 * dVar393;
          auVar246 = divpd(auVar260,_DAT_01095630);
          dVar245 = auVar246._8_8_ +
                    auVar417._8_8_ +
                    auVar166._8_8_ +
                    auVar266._8_8_ +
                    auVar215._8_8_ +
                    auVar403._8_8_ +
                    (((auVar267._0_8_ - auVar267._8_8_) + auVar219._0_8_) - auVar219._8_8_) +
                    (dVar452 * dVar245) / 8.121312287389663e+33 +
                    auVar246._0_8_ +
                    auVar417._0_8_ +
                    auVar166._0_8_ +
                    auVar266._0_8_ +
                    auVar215._0_8_ +
                    auVar403._0_8_ +
                    dVar416 * -3.0438311688311688e-05 * dVar245 +
                    (dVar441 * dVar245) / 1920.0 +
                    dVar124 * dVar245 + auVar125._8_8_ + auVar125._0_8_;
        }
        auVar143._0_8_ = dVar398 * dVar75;
        auVar143._8_8_ = dVar75;
        auVar406._0_8_ = dVar414 * auVar143._0_8_;
        auVar406._8_8_ = dVar414 * dVar75;
        dVar398 = 1.0 / auVar406._0_8_;
        auVar93._0_8_ = auVar143._0_8_ * dVar422;
        auVar93._8_8_ = dVar75 * dVar422;
        dVar442 = 1.0 / auVar93._0_8_;
        auVar301._8_8_ = dVar437;
        auVar301._0_8_ = dVar437;
        auVar387._8_8_ = dVar437;
        auVar387._0_8_ = dVar437;
        auVar215 = divpd(auVar387,auVar93);
        dVar265 = 1.0 / auVar93._8_8_;
        auVar419._0_8_ = dVar422 * auVar406._0_8_;
        auVar419._8_8_ = dVar422 * auVar406._8_8_;
        dVar366 = 1.0 / auVar419._8_8_;
        dVar75 = 1.0 / auVar419._0_8_;
        auVar279._8_8_ = dVar437;
        auVar279._0_8_ = dVar437;
        auVar417 = divpd(auVar279,auVar143);
        auVar94._8_8_ = dVar437;
        auVar94._0_8_ = dVar437;
        auVar125 = divpd(auVar94,auVar406);
        auVar246 = divpd(auVar301,auVar419);
        auVar431._8_8_ = dVar212;
        auVar431._0_8_ = dVar212;
        auVar95._8_8_ = dVar212;
        auVar95._0_8_ = dVar212;
        auVar166 = divpd(auVar431,auVar143);
        dVar436 = auVar166._8_8_;
        auVar266 = divpd(auVar95,auVar406);
        dVar414 = (1.0 / auVar406._8_8_) * -0.001530612244897959;
        dVar382 = (1.0 / dVar363) * dVar382;
        dVar453 = dVar321 * dVar163 * 72.0;
        dVar401 = dVar236 * 1.7724538509055159 * 240.0;
        dVar212 = dVar449 * dVar66 * -2.0;
        uVar23 = -(ulong)(0.32 < dVar102);
        dVar422 = auVar417._8_8_;
        dVar394 = auVar215._8_8_;
        dVar449 = auVar246._8_8_;
        local_7b8 = auVar125._0_8_;
        dStack_7b0 = auVar125._8_8_;
        local_b28 = auVar266._0_8_;
        dStack_b20 = auVar266._8_8_;
        dVar426 = auVar166._0_8_;
        dVar321 = auVar417._0_8_;
        dVar385 = auVar215._0_8_;
        dVar437 = auVar246._0_8_;
        if (dVar102 < 0.32) {
          dVar26 = (double)(~uVar23 & (ulong)dVar26);
          dVar26 = dVar26 * 1.1428571428571428 * dVar115 +
                   dVar236 * 1.1428571428571428 *
                   (dVar65 * dVar26 * dVar212 +
                   dVar401 * dVar26 * dVar67 +
                   (dVar319 * dVar26 * 30720.0 +
                   dVar236 * dVar26 * 448.0 + dVar363 * dVar26 * -5760.0) * dVar117 +
                   dVar453 * dVar26 +
                   (dVar344 * dVar26 * -2880.0 +
                   dVar163 * dVar26 * 768.0 +
                   dVar26 * -8.0 + dVar26 * -1105920.0 * dVar116 + dVar26 * 26880.0 * dVar320) *
                   dVar66 + dVar66 * dVar26 * dVar382 * 0.5);
        }
        else {
          dVar26 = (double)((ulong)dVar26 & uVar23);
          auVar280._0_8_ = dVar321 * dVar26;
          auVar280._8_8_ = dVar422 * dVar26;
          auVar215 = divpd(auVar280,_DAT_01095640);
          auVar175._0_8_ = local_7b8 * dVar26;
          auVar175._8_8_ = dStack_7b0 * dVar26;
          auVar266 = divpd(auVar175,_DAT_01095650);
          auVar176._0_8_ = dVar385 * dVar26;
          auVar176._8_8_ = dVar394 * dVar26;
          auVar417 = divpd(auVar176,_DAT_01095660);
          auVar177._0_8_ = dVar437 * dVar26;
          auVar177._8_8_ = dVar449 * dVar26;
          auVar246 = divpd(auVar177,_DAT_01095670);
          auVar432._0_8_ = dVar426 * dVar26;
          auVar432._8_8_ = dVar436 * dVar26;
          auVar166 = divpd(auVar432,_DAT_01095680);
          auVar144._0_8_ = dVar26 * local_b28;
          auVar144._8_8_ = dVar26 * dStack_b20;
          auVar125 = divpd(auVar144,_DAT_01095690);
          dVar26 = (((((((((((((dVar26 * dVar75) / 8272281600.0 +
                              (dVar366 * dVar26) / -210862080.0 +
                              (dVar442 * dVar26) / 6150144.0 +
                              dVar265 * -4.6972703222703225e-06 * dVar26 +
                              dVar414 * dVar26 + (dVar398 * dVar26) / 9408.0) - auVar215._8_8_) +
                            auVar215._0_8_) - auVar266._8_8_) + auVar266._0_8_) - auVar417._8_8_) +
                        auVar417._0_8_) - auVar246._8_8_) + auVar246._0_8_) - auVar166._8_8_) +
                    auVar166._0_8_) - auVar125._8_8_) + auVar125._0_8_;
        }
        dVar76 = 0.0;
        if (dVar1 < __x_00) {
          dVar76 = (dVar26 * 1.8171205928321397 * dVar34 * 0.026329605555555555 * dVar213 +
                   (dVar123 + dVar74) * dVar211 + dVar245 * dVar161 * 0.43209876543209874 * dVar162)
                   * dVar68 +
                   ((double)(~uVar11 & (ulong)(local_258 * dVar54 * 1.3333333333333333)) * dVar29 *
                    -0.36927938319101117 * dVar243 - dVar25);
        }
        pdVar4 = out->vrho;
        if ((pdVar4 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vrho * sVar9;
          pdVar4[lVar7] = (local_268 + dVar76) * __x + local_688 + pdVar4[lVar7];
        }
        dVar69 = -dVar97 - dVar69;
        dVar74 = 0.0;
        dVar26 = 0.0;
        if (bVar6 && bVar5) {
          dVar26 = dVar69;
        }
        if (1e-10 <= dVar103) {
          dVar74 = (dVar40 * dVar32 * dVar31 *
                   (double)(~uVar16 &
                           (ulong)((dVar42 * (double)(~uVar15 & ~uVar14 & (ulong)dVar69)) / 3.0)) *
                   dVar41) / -18.0 - dVar70;
        }
        if (dVar30 < 1.35) {
          dVar41 = (double)(~uVar19 & (ulong)dVar74);
          dVar40 = dVar104 * -2.6666666666666665 *
                   ((((dVar105 * dVar41 + dVar71 * dVar41 * dVar45 * 0.5) - dVar41 * dVar43 * dVar45
                     ) * dVar205 + dVar317 * dVar41) - dVar41 * dVar342);
          dVar41 = dVar41 * -2.6666666666666665 * dVar44;
        }
        else {
          dVar40 = (double)(uVar19 & (ulong)dVar74);
          auVar302._0_8_ = -dVar264 * dVar40;
          auVar302._8_8_ = dVar361 * dVar40;
          auVar266 = divpd(auVar302,_DAT_01033a00);
          auVar351._0_8_ = dVar438 * dVar40;
          auVar351._8_8_ = dVar446 * dVar40;
          auVar246 = divpd(auVar351,_DAT_01033a10);
          auVar303._0_8_ = dVar314 * dVar40;
          auVar303._8_8_ = dVar420 * dVar40;
          auVar417 = divpd(auVar303,_DAT_01033a20);
          auVar227._0_8_ = dVar40 * dVar423;
          auVar227._8_8_ = dVar40 * dVar434;
          auVar125 = divpd(auVar227,_DAT_01033a30);
          dVar40 = auVar125._0_8_;
          dVar41 = (((((auVar266._8_8_ + auVar266._0_8_) - auVar246._8_8_) + auVar246._0_8_) -
                    auVar417._8_8_) + auVar417._0_8_) - auVar125._8_8_;
        }
        if (dVar30 < 0.27) {
          dVar70 = (double)(~uVar20 & (ulong)dVar74);
          dVar42 = (dVar70 * dVar121 +
                   dVar70 * 10.0 * 1.7724538509055159 * dVar49 +
                   dVar151 * dVar70 * -72.0 +
                   (dVar151 * dVar70 * 40.0 - dVar411 * dVar70) * dVar48 +
                   dVar48 * dVar70 * dVar153 * 0.5 + dVar411 * dVar70) * 24.0 * dVar106;
          dVar70 = dVar70 * 48.0 * dVar234;
        }
        else {
          dVar70 = (double)(uVar20 & (ulong)dVar74);
          auVar388._0_8_ = dVar439 * dVar70;
          auVar388._8_8_ = dVar447 * dVar70;
          auVar166 = divpd(auVar388,_DAT_010955b0);
          auVar304._0_8_ = local_5e8 * dVar70;
          auVar304._8_8_ = dStack_5e0 * dVar70;
          auVar266 = divpd(auVar304,_DAT_010955c0);
          auVar407._0_8_ = -dVar72 * dVar70;
          auVar407._8_8_ = dVar395 * dVar70;
          auVar219 = divpd(auVar407,_DAT_010955d0);
          auVar352._0_8_ = dVar343 * dVar70;
          auVar352._8_8_ = dVar359 * dVar70;
          auVar417 = divpd(auVar352,_DAT_010955e0);
          auVar389._0_8_ = local_6c8 * dVar70;
          auVar389._8_8_ = dStack_6c0 * dVar70;
          auVar267 = divpd(auVar389,_DAT_010955f0);
          auVar353._0_8_ = local_6d8 * dVar70;
          auVar353._8_8_ = dStack_6d0 * dVar70;
          auVar246 = divpd(auVar353,_DAT_01095600);
          auVar390._0_8_ = dVar399 * dVar70;
          auVar390._8_8_ = dVar410 * dVar70;
          auVar403 = divpd(auVar390,_DAT_01095610);
          auVar354._0_8_ = local_6b8 * dVar70;
          auVar354._8_8_ = dStack_6b0 * dVar70;
          auVar215 = divpd(auVar354,_DAT_01095620);
          auVar228._0_8_ = dVar70 * local_5b8;
          auVar228._8_8_ = dVar70 * dStack_5b0;
          auVar125 = divpd(auVar228,_DAT_01095630);
          dVar42 = auVar125._0_8_ +
                   auVar215._0_8_ +
                   auVar403._0_8_ +
                   auVar246._0_8_ +
                   auVar267._0_8_ +
                   auVar417._0_8_ +
                   dVar261 * dVar70 * -3.0438311688311688e-05 +
                   (dVar70 * dVar378) / 1920.0 + dVar450 * dVar70 + auVar219._8_8_ + auVar219._0_8_;
          dVar70 = auVar125._8_8_ +
                   auVar215._8_8_ +
                   auVar403._8_8_ +
                   auVar246._8_8_ +
                   auVar267._8_8_ +
                   auVar417._8_8_ +
                   (((auVar166._0_8_ - auVar166._8_8_) + auVar266._0_8_) - auVar266._8_8_) +
                   (dVar415 * dVar70) / 8.121312287389663e+33;
        }
        if (dVar30 < 0.32) {
          dVar74 = (double)(~uVar21 & (ulong)dVar74);
          dVar74 = dVar74 * 1.1428571428571428 * dVar107 +
                   dVar33 * 1.1428571428571428 *
                   (dVar50 * dVar74 * dVar424 +
                   dVar52 * dVar74 * dVar323 +
                   (dVar237 * dVar74 * 30720.0 +
                   dVar33 * dVar74 * 448.0 + dVar318 * dVar74 * -5760.0) * dVar109 +
                   dVar383 * dVar74 +
                   (dVar238 * dVar74 * 26880.0 +
                   dVar285 * dVar74 * -2880.0 +
                   dVar157 * dVar74 * 768.0 + dVar74 * -1105920.0 * dVar108 + dVar74 * -8.0) *
                   dVar51 + dVar51 * dVar74 * dVar421 * 0.5);
        }
        else {
          dVar74 = (double)((ulong)dVar74 & uVar21);
          auVar305._0_8_ = local_378 * dVar74;
          auVar305._8_8_ = dStack_370 * dVar74;
          auVar266 = divpd(auVar305,_DAT_01095640);
          auVar306._0_8_ = local_368 * dVar74;
          auVar306._8_8_ = dStack_360 * dVar74;
          auVar417 = divpd(auVar306,_DAT_01095650);
          auVar307._0_8_ = dVar262 * dVar74;
          auVar307._8_8_ = dVar396 * dVar74;
          auVar246 = divpd(auVar307,_DAT_01095660);
          auVar308._0_8_ = dVar451 * dVar74;
          auVar308._8_8_ = dVar460 * dVar74;
          auVar215 = divpd(auVar308,_DAT_01095670);
          auVar309._0_8_ = dVar286 * dVar74;
          auVar309._8_8_ = dVar322 * dVar74;
          auVar166 = divpd(auVar309,_DAT_01095680);
          auVar96._0_8_ = dVar74 * dVar448;
          auVar96._8_8_ = dVar74 * dVar360;
          auVar125 = divpd(auVar96,_DAT_01095690);
          dVar74 = (((((((((((((dVar74 * dVar412) / 8272281600.0 +
                              (dVar440 * dVar74) / -210862080.0 +
                              (dVar244 * dVar74) / 6150144.0 +
                              dVar364 * dVar74 * -4.6972703222703225e-06 +
                              dVar400 * dVar74 + (dVar379 * dVar74) / 9408.0) - auVar266._8_8_) +
                            auVar266._0_8_) - auVar417._8_8_) + auVar417._0_8_) - auVar246._8_8_) +
                        auVar246._0_8_) - auVar215._8_8_) + auVar215._0_8_) - auVar166._8_8_) +
                    auVar166._0_8_) - auVar125._8_8_) + auVar125._0_8_;
        }
        dVar245 = 0.0;
        dVar123 = 0.0;
        if (dVar77 < dVar24) {
          dVar123 = (dVar74 * 1.8171205928321397 * dVar34 * 0.026329605555555555 * dVar207 +
                    (dVar41 + dVar40) * dVar154 +
                    (dVar70 + dVar42) * dVar155 * 0.43209876543209874 * dVar156) * dVar53 +
                    ((double)(~uVar13 & (ulong)(dVar28 * 1.3333333333333333 * dVar26)) * dVar29 *
                     -0.36927938319101117 * dVar240 - dVar165);
        }
        dVar26 = 0.0;
        if (bVar6 && bVar5) {
          dVar26 = dVar97 - dVar118;
        }
        dVar40 = dVar32 * (dVar284 / dVar56);
        dVar41 = (dVar158 / (__x_00 * dVar110)) * local_c20;
        dVar28 = dVar35 * -0.40121303703703703 * dVar41 +
                 local_c20 * local_c20 * dVar101 * -0.014346394913206906 *
                 ((1.0 / dVar55) / (dVar110 * dVar110 * dVar110));
        if (1e-10 <= dVar57) {
          auVar178._0_8_ = dVar28 * dVar149 * dVar31 * dVar40;
          auVar178._8_8_ =
               (double)(~uVar18 &
                       (ulong)(((double)(~uVar14 & ~uVar15 & (ulong)-dVar69) * dVar150) / 3.0)) *
               dVar99 * dVar31 * dVar32 * dVar284;
          auVar125 = divpd(auVar178,_DAT_01095980);
          dVar245 = (-dVar98 - auVar125._0_8_) - auVar125._8_8_;
        }
        dVar380 = -dVar380;
        if (dVar102 < 1.35) {
          dVar35 = (double)(~uVar12 & (ulong)dVar245);
          dVar32 = (dVar119 * dVar35 + dVar362 * dVar35 * dVar61 * 0.5) - dVar35 * dVar59 * dVar61;
          dVar32 = dVar112 * -2.6666666666666665 *
                   ((dVar32 + dVar32) * dVar112 + dVar380 * dVar35 + (dVar35 + dVar35) * dVar209);
          dVar35 = dVar35 * -2.6666666666666665 * dVar60;
        }
        else {
          dVar32 = (double)(uVar12 & (ulong)dVar245);
          auVar229._0_8_ = -dVar58 * dVar32;
          auVar229._8_8_ = dVar120 * dVar32;
          auVar266 = divpd(auVar229,_DAT_01033a00);
          auVar310._0_8_ = dVar164 * dVar32;
          auVar310._8_8_ = dVar73 * dVar32;
          auVar246 = divpd(auVar310,_DAT_01033a10);
          auVar230._0_8_ = dVar365 * dVar32;
          auVar230._8_8_ = dVar113 * dVar32;
          auVar417 = divpd(auVar230,_DAT_01033a20);
          auVar179._0_8_ = dVar32 * dVar203;
          auVar179._8_8_ = dVar32 * dVar233;
          auVar125 = divpd(auVar179,_DAT_01033a30);
          dVar32 = auVar125._0_8_;
          dVar35 = (((((auVar266._8_8_ + auVar266._0_8_) - auVar246._8_8_) + auVar246._0_8_) -
                    auVar417._8_8_) + auVar417._0_8_) - auVar125._8_8_;
        }
        if (dVar102 < 0.27) {
          dVar42 = (double)(~uVar22 & (ulong)dVar245);
          dVar42 = dVar210 * 48.0 * dVar42 +
                   (dVar214 * dVar42 +
                   dVar42 * 10.0 * 1.7724538509055159 * dVar64 +
                   dVar27 * dVar42 * -72.0 +
                   (dVar27 * dVar42 * 40.0 - dVar345 * dVar42) * dVar63 +
                   dVar63 * dVar42 * dVar160 * 0.5 + dVar345 * dVar42) * 24.0 * dVar114;
        }
        else {
          dVar42 = (double)(uVar22 & (ulong)dVar245);
          auVar371._0_8_ = dVar324 * dVar42;
          auVar371._8_8_ = dVar341 * dVar42;
          auVar166 = divpd(auVar371,_DAT_010955b0);
          auVar231._0_8_ = (double)local_608._0_8_ * dVar42;
          auVar231._8_8_ = (double)local_608._8_8_ * dVar42;
          auVar266 = divpd(auVar231,_DAT_010955c0);
          auVar408._0_8_ = -dVar287 * dVar42;
          auVar408._8_8_ = dVar413 * dVar42;
          auVar219 = divpd(auVar408,_DAT_010955d0);
          auVar311._0_8_ = dVar425 * dVar42;
          auVar311._8_8_ = dVar435 * dVar42;
          auVar417 = divpd(auVar311,_DAT_010955e0);
          auVar372._0_8_ = dVar381 * dVar42;
          auVar372._8_8_ = dVar397 * dVar42;
          auVar267 = divpd(auVar372,_DAT_010955f0);
          auVar312._0_8_ = local_738 * dVar42;
          auVar312._8_8_ = dStack_730 * dVar42;
          auVar246 = divpd(auVar312,_DAT_01095600);
          auVar373._0_8_ = dVar288 * dVar42;
          auVar373._8_8_ = dVar315 * dVar42;
          auVar403 = divpd(auVar373,_DAT_01095610);
          auVar313._0_8_ = local_b48 * dVar42;
          auVar313._8_8_ = dStack_b40 * dVar42;
          auVar215 = divpd(auVar313,_DAT_01095620);
          auVar180._0_8_ = dVar42 * dVar384;
          auVar180._8_8_ = dVar42 * dVar393;
          auVar125 = divpd(auVar180,_DAT_01095630);
          dVar42 = auVar125._8_8_ +
                   auVar215._8_8_ +
                   auVar403._8_8_ +
                   auVar246._8_8_ +
                   auVar267._8_8_ +
                   auVar417._8_8_ +
                   (((auVar166._0_8_ - auVar166._8_8_) + auVar266._0_8_) - auVar266._8_8_) +
                   (dVar452 * dVar42) / 8.121312287389663e+33 +
                   auVar125._0_8_ +
                   auVar215._0_8_ +
                   auVar403._0_8_ +
                   auVar246._0_8_ +
                   auVar267._0_8_ +
                   auVar417._0_8_ +
                   dVar416 * dVar42 * -3.0438311688311688e-05 +
                   (dVar42 * dVar441) / 1920.0 + dVar124 * dVar42 + auVar219._8_8_ + auVar219._0_8_;
        }
        if (dVar102 < 0.32) {
          dVar245 = (double)(~uVar23 & (ulong)dVar245);
          dVar97 = dVar245 * 1.1428571428571428 * dVar115 +
                   dVar236 * 1.1428571428571428 *
                   (dVar65 * dVar245 * dVar212 +
                   dVar67 * dVar245 * dVar401 +
                   (dVar319 * dVar245 * 30720.0 +
                   dVar236 * dVar245 * 448.0 + dVar363 * dVar245 * -5760.0) * dVar117 +
                   dVar453 * dVar245 +
                   (dVar320 * dVar245 * 26880.0 +
                   dVar344 * dVar245 * -2880.0 +
                   dVar163 * dVar245 * 768.0 + dVar245 * -1105920.0 * dVar116 + dVar245 * -8.0) *
                   dVar66 + dVar66 * dVar245 * dVar382 * 0.5);
        }
        else {
          dVar245 = (double)((ulong)dVar245 & uVar23);
          auVar181._0_8_ = dVar321 * dVar245;
          auVar181._8_8_ = dVar422 * dVar245;
          auVar125 = divpd(auVar181,_DAT_01095640);
          auVar182._0_8_ = local_7b8 * dVar245;
          auVar182._8_8_ = dStack_7b0 * dVar245;
          auVar266 = divpd(auVar182,_DAT_01095650);
          auVar183._0_8_ = dVar385 * dVar245;
          auVar183._8_8_ = dVar394 * dVar245;
          auVar417 = divpd(auVar183,_DAT_01095660);
          auVar184._0_8_ = dVar437 * dVar245;
          auVar184._8_8_ = dVar449 * dVar245;
          auVar246 = divpd(auVar184,_DAT_01095670);
          auVar185._0_8_ = dVar426 * dVar245;
          auVar185._8_8_ = dVar436 * dVar245;
          auVar215 = divpd(auVar185,_DAT_01095680);
          auVar355._0_8_ = dVar245 * local_b28;
          auVar355._8_8_ = dVar245 * dStack_b20;
          auVar166 = divpd(auVar355,_DAT_01095690);
          dVar97 = (((((((((((((dVar245 * dVar75) / 8272281600.0 +
                              (dVar366 * dVar245) / -210862080.0 +
                              (dVar442 * dVar245) / 6150144.0 +
                              dVar265 * dVar245 * -4.6972703222703225e-06 +
                              dVar414 * dVar245 + (dVar398 * dVar245) / 9408.0) - auVar125._8_8_) +
                            auVar125._0_8_) - auVar266._8_8_) + auVar266._0_8_) - auVar417._8_8_) +
                        auVar417._0_8_) - auVar246._8_8_) + auVar246._0_8_) - auVar215._8_8_) +
                    auVar215._0_8_) - auVar166._8_8_) + auVar166._0_8_;
        }
        local_a38 = local_a38 * (dVar211 / dVar56);
        dVar56 = dVar62 / dVar56;
        dVar98 = dVar161 * dVar241 * 1.8171205928321397 * -0.1728395061728395;
        dVar99 = 0.0;
        if (dVar1 < __x_00) {
          dVar99 = (dVar28 * dVar56 * dVar111 * dVar242 * -0.010531842222222223 +
                   dVar97 * 1.8171205928321397 * dVar34 * 0.026329605555555555 * dVar213 +
                   dVar28 * dVar34 * dVar56 * dVar98 +
                   (local_af0 * 0.24256886666666666 * dVar159 + dVar41 * -0.11279007555555555) *
                   dVar241 * 0.43209876543209874 * dVar162 +
                   dVar42 * dVar161 * 0.43209876543209874 * dVar162 +
                   (dVar35 + dVar32) * dVar211 + (dVar28 * local_a38) / -5.0 +
                   dVar41 * dVar62 * dVar242 * -0.07021228148148148) * dVar68 +
                   ((double)(~uVar11 & (ulong)(dVar26 * dVar54 * 1.3333333333333333)) * dVar29 *
                    -0.36927938319101117 * dVar243 - dVar25);
        }
        if ((pdVar4 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vrho * sVar9;
          pdVar4[lVar7 + 1] = (dVar123 + dVar99) * __x + local_688 + pdVar4[lVar7 + 1];
        }
        dVar25 = dVar38 * dVar37 + dVar204 * local_b70 * dVar101 * 0.00537989809245259;
        dVar26 = 0.0;
        if (1e-10 <= dVar103) {
          dVar26 = (dVar36 * dVar31 * dVar148 * dVar25) / -180.0;
        }
        if (dVar30 < 1.35) {
          dVar28 = (double)(~uVar19 & (ulong)dVar26);
          local_858 = dVar44 * dVar28 * -2.6666666666666665 +
                      dVar104 * -2.6666666666666665 *
                      ((dVar205 * ((dVar105 * dVar28 + dVar71 * dVar28 * dVar45 * 0.5) -
                                  dVar43 * dVar28 * dVar45) + dVar317 * dVar28) - dVar342 * dVar28);
        }
        else {
          dVar28 = (double)(uVar19 & (ulong)dVar26);
          auVar145._0_8_ = -dVar264 * dVar28;
          auVar145._8_8_ = dVar361 * dVar28;
          auVar125 = divpd(auVar145,_DAT_01033a00);
          auVar339._0_8_ = dVar438 * dVar28;
          auVar339._8_8_ = dVar446 * dVar28;
          auVar417 = divpd(auVar339,_DAT_01033a10);
          auVar356._0_8_ = dVar314 * dVar28;
          auVar356._8_8_ = dVar420 * dVar28;
          auVar246 = divpd(auVar356,_DAT_01033a20);
          auVar186._0_8_ = dVar423 * dVar28;
          auVar186._8_8_ = dVar434 * dVar28;
          auVar266 = divpd(auVar186,_DAT_01033a30);
          local_858 = ((((((auVar125._8_8_ + auVar125._0_8_) - auVar417._8_8_) + auVar417._0_8_) -
                        auVar246._8_8_) + auVar246._0_8_) - auVar266._8_8_) + auVar266._0_8_;
        }
        if (dVar30 < 0.27) {
          dVar28 = (double)(~uVar20 & (ulong)dVar26);
          dVar106 = dVar106 * (dVar121 * dVar28 +
                              dVar28 * 10.0 * 1.7724538509055159 * dVar49 +
                              dVar151 * dVar28 * -72.0 +
                              dVar153 * dVar48 * dVar28 * 0.5 +
                              (dVar151 * dVar28 * 40.0 - dVar411 * dVar28) * dVar48 +
                              dVar411 * dVar28) * 24.0;
          dVar234 = dVar28 * 48.0 * dVar234;
        }
        else {
          dVar28 = (double)(uVar20 & (ulong)dVar26);
          auVar374._0_8_ = dVar439 * dVar28;
          auVar374._8_8_ = dVar447 * dVar28;
          auVar403 = divpd(auVar374,_DAT_010955b0);
          auVar187._0_8_ = local_5e8 * dVar28;
          auVar187._8_8_ = dStack_5e0 * dVar28;
          auVar417 = divpd(auVar187,_DAT_010955c0);
          auVar188._0_8_ = -dVar72 * dVar28;
          auVar188._8_8_ = dVar395 * dVar28;
          auVar246 = divpd(auVar188,_DAT_010955d0);
          auVar189._0_8_ = dVar343 * dVar28;
          auVar189._8_8_ = dVar359 * dVar28;
          auVar215 = divpd(auVar189,_DAT_010955e0);
          auVar146._0_8_ = local_6c8 * dVar28;
          auVar146._8_8_ = dStack_6c0 * dVar28;
          auVar125 = divpd(auVar146,_DAT_010955f0);
          auVar190._0_8_ = local_6d8 * dVar28;
          auVar190._8_8_ = dStack_6d0 * dVar28;
          auVar166 = divpd(auVar190,_DAT_01095600);
          auVar391._0_8_ = dVar399 * dVar28;
          auVar391._8_8_ = dVar410 * dVar28;
          auVar219 = divpd(auVar391,_DAT_01095610);
          auVar147._0_8_ = local_6b8 * dVar28;
          auVar147._8_8_ = dStack_6b0 * dVar28;
          auVar266 = divpd(auVar147,_DAT_01095620);
          auVar191._0_8_ = local_5b8 * dVar28;
          auVar191._8_8_ = dStack_5b0 * dVar28;
          auVar267 = divpd(auVar191,_DAT_01095630);
          dVar106 = auVar267._0_8_ +
                    auVar266._0_8_ +
                    auVar219._0_8_ +
                    auVar166._0_8_ +
                    auVar125._0_8_ +
                    auVar215._0_8_ +
                    dVar261 * dVar28 * -3.0438311688311688e-05 +
                    (dVar378 * dVar28) / 1920.0 + dVar450 * dVar28 + auVar246._8_8_ + auVar246._0_8_
          ;
          dVar234 = auVar267._8_8_ +
                    auVar266._8_8_ +
                    auVar219._8_8_ +
                    auVar166._8_8_ +
                    auVar125._8_8_ +
                    auVar215._8_8_ +
                    (((auVar403._0_8_ - auVar403._8_8_) + auVar417._0_8_) - auVar417._8_8_) +
                    (dVar415 * dVar28) / 8.121312287389663e+33;
        }
        if (dVar30 < 0.32) {
          dVar26 = (double)(~uVar21 & (ulong)dVar26);
          dVar30 = dVar26 * 1.1428571428571428 * dVar107 +
                   dVar33 * 1.1428571428571428 *
                   (dVar424 * dVar50 * dVar26 +
                   dVar323 * dVar52 * dVar26 +
                   dVar109 * (dVar237 * dVar26 * 30720.0 +
                             dVar33 * dVar26 * 448.0 + dVar318 * dVar26 * -5760.0) +
                   dVar383 * dVar26 +
                   dVar421 * dVar51 * dVar26 * 0.5 +
                   (dVar238 * dVar26 * 26880.0 +
                   dVar285 * dVar26 * -2880.0 +
                   dVar157 * dVar26 * 768.0 + dVar26 * -1105920.0 * dVar108 + dVar26 * -8.0) *
                   dVar51);
        }
        else {
          dVar26 = (double)(uVar21 & (ulong)dVar26);
          auVar192._0_8_ = local_378 * dVar26;
          auVar192._8_8_ = dStack_370 * dVar26;
          auVar125 = divpd(auVar192,_DAT_01095640);
          auVar193._0_8_ = local_368 * dVar26;
          auVar193._8_8_ = dStack_360 * dVar26;
          auVar266 = divpd(auVar193,_DAT_01095650);
          auVar357._0_8_ = dVar262 * dVar26;
          auVar357._8_8_ = dVar396 * dVar26;
          auVar215 = divpd(auVar357,_DAT_01095660);
          auVar194._0_8_ = dVar451 * dVar26;
          auVar194._8_8_ = dVar460 * dVar26;
          auVar417 = divpd(auVar194,_DAT_01095670);
          auVar392._0_8_ = dVar286 * dVar26;
          auVar392._8_8_ = dVar322 * dVar26;
          auVar166 = divpd(auVar392,_DAT_01095680);
          auVar195._0_8_ = dVar448 * dVar26;
          auVar195._8_8_ = dVar360 * dVar26;
          auVar246 = divpd(auVar195,_DAT_01095690);
          dVar30 = (((((((((((((dVar412 * dVar26) / 8272281600.0 +
                              (dVar440 * dVar26) / -210862080.0 +
                              (dVar244 * dVar26) / 6150144.0 +
                              dVar364 * dVar26 * -4.6972703222703225e-06 +
                              dVar400 * dVar26 + (dVar379 * dVar26) / 9408.0) - auVar125._8_8_) +
                            auVar125._0_8_) - auVar266._8_8_) + auVar266._0_8_) - auVar215._8_8_) +
                        auVar215._0_8_) - auVar417._8_8_) + auVar417._0_8_) - auVar166._8_8_) +
                    auVar166._0_8_) - auVar246._8_8_) + auVar246._0_8_;
        }
        dVar26 = 0.0;
        if (dVar77 < dVar24) {
          dVar26 = dVar53 * (dVar239 * -0.010531842222222223 * dVar152 * dVar39 * dVar25 +
                            dVar30 * 1.8171205928321397 * dVar34 * 0.026329605555555555 * dVar207 +
                            dVar122 * dVar34 * dVar39 * dVar25 +
                            dVar37 * dVar235 * 0.018276169650205763 * dVar156 +
                            dVar155 * (dVar234 + dVar106) * 0.43209876543209874 * dVar156 +
                            local_858 * dVar154 + (local_848 * dVar25) / -5.0 +
                            dVar34 * dVar37 * dVar47 *
                            dVar206 * 1.8171205928321397 * 0.026329605555555555);
        }
        pdVar4 = out->vsigma;
        if ((pdVar4 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vsigma * sVar9;
          dVar77 = (pdVar4 + lVar7)[1];
          pdVar4[lVar7] = dVar26 * __x + pdVar4[lVar7];
          (pdVar4 + lVar7)[1] = dVar77 + 0.0;
        }
        dVar25 = dVar38 * dVar159 + dVar101 * 0.00537989809245259 * local_c20 * dVar208;
        dVar77 = 0.0;
        if (1e-10 <= dVar57) {
          dVar77 = (dVar40 * dVar31 * dVar149 * dVar25) / -180.0;
        }
        if (dVar102 < 1.35) {
          dVar30 = (double)(~uVar12 & (ulong)dVar77);
          dVar26 = (dVar119 * dVar30 + dVar362 * dVar30 * dVar61 * 0.5) - dVar59 * dVar30 * dVar61;
          dVar26 = dVar112 * -2.6666666666666665 *
                   ((dVar26 + dVar26) * dVar112 + dVar380 * dVar30 + dVar209 * (dVar30 + dVar30));
          dVar60 = dVar30 * -2.6666666666666665 * dVar60;
        }
        else {
          dVar30 = (double)(uVar12 & (ulong)dVar77);
          auVar358._0_8_ = -dVar58 * dVar30;
          auVar358._8_8_ = dVar120 * dVar30;
          auVar417 = divpd(auVar358,_DAT_01033a00);
          auVar375._0_8_ = dVar164 * dVar30;
          auVar375._8_8_ = dVar73 * dVar30;
          auVar246 = divpd(auVar375,_DAT_01033a10);
          auVar340._0_8_ = dVar365 * dVar30;
          auVar340._8_8_ = dVar113 * dVar30;
          auVar266 = divpd(auVar340,_DAT_01033a20);
          auVar196._0_8_ = dVar203 * dVar30;
          auVar196._8_8_ = dVar233 * dVar30;
          auVar125 = divpd(auVar196,_DAT_01033a30);
          dVar26 = auVar125._0_8_;
          dVar60 = (((((auVar417._8_8_ + auVar417._0_8_) - auVar246._8_8_) + auVar246._0_8_) -
                    auVar266._8_8_) + auVar266._0_8_) - auVar125._8_8_;
        }
        if (dVar102 < 0.27) {
          dVar30 = (double)(~uVar22 & (ulong)dVar77);
          dVar114 = dVar114 * (dVar214 * dVar30 +
                              dVar30 * 10.0 * 1.7724538509055159 * dVar64 +
                              dVar27 * dVar30 * -72.0 +
                              dVar160 * dVar63 * dVar30 * 0.5 +
                              (dVar27 * dVar30 * 40.0 - dVar345 * dVar30) * dVar63 +
                              dVar345 * dVar30) * 24.0;
          dVar30 = dVar210 * 48.0 * dVar30;
        }
        else {
          dVar30 = (double)(uVar22 & (ulong)dVar77);
          auVar459._0_8_ = dVar324 * dVar30;
          auVar459._8_8_ = dVar341 * dVar30;
          auVar219 = divpd(auVar459,_DAT_010955b0);
          auVar197._0_8_ = (double)local_608._0_8_ * dVar30;
          auVar197._8_8_ = (double)local_608._8_8_ * dVar30;
          auVar125 = divpd(auVar197,_DAT_010955c0);
          auVar433._0_8_ = -dVar287 * dVar30;
          auVar433._8_8_ = dVar413 * dVar30;
          auVar403 = divpd(auVar433,_DAT_010955d0);
          auVar281._0_8_ = dVar425 * dVar30;
          auVar281._8_8_ = dVar435 * dVar30;
          auVar246 = divpd(auVar281,_DAT_010955e0);
          auVar198._0_8_ = dVar381 * dVar30;
          auVar198._8_8_ = dVar397 * dVar30;
          auVar266 = divpd(auVar198,_DAT_010955f0);
          auVar282._0_8_ = local_738 * dVar30;
          auVar282._8_8_ = dStack_730 * dVar30;
          auVar215 = divpd(auVar282,_DAT_01095600);
          auVar376._0_8_ = dVar288 * dVar30;
          auVar376._8_8_ = dVar315 * dVar30;
          auVar267 = divpd(auVar376,_DAT_01095610);
          auVar283._0_8_ = local_b48 * dVar30;
          auVar283._8_8_ = dStack_b40 * dVar30;
          auVar166 = divpd(auVar283,_DAT_01095620);
          auVar199._0_8_ = dVar384 * dVar30;
          auVar199._8_8_ = dVar393 * dVar30;
          auVar417 = divpd(auVar199,_DAT_01095630);
          dVar114 = auVar417._0_8_ +
                    auVar166._0_8_ +
                    auVar267._0_8_ +
                    auVar215._0_8_ +
                    auVar266._0_8_ +
                    auVar246._0_8_ +
                    dVar416 * dVar30 * -3.0438311688311688e-05 +
                    (dVar441 * dVar30) / 1920.0 + dVar124 * dVar30 + auVar403._8_8_ + auVar403._0_8_
          ;
          dVar30 = auVar417._8_8_ +
                   auVar166._8_8_ +
                   auVar267._8_8_ +
                   auVar215._8_8_ +
                   auVar266._8_8_ +
                   auVar246._8_8_ +
                   (((auVar219._0_8_ - auVar219._8_8_) + auVar125._0_8_) - auVar125._8_8_) +
                   (dVar452 * dVar30) / 8.121312287389663e+33;
        }
        if (dVar102 < 0.32) {
          dVar77 = (double)(~uVar23 & (ulong)dVar77);
          dVar77 = dVar77 * 1.1428571428571428 * dVar115 +
                   dVar236 * 1.1428571428571428 *
                   (dVar212 * dVar65 * dVar77 +
                   dVar401 * dVar67 * dVar77 +
                   dVar117 * (dVar319 * dVar77 * 30720.0 +
                             dVar236 * dVar77 * 448.0 + dVar363 * dVar77 * -5760.0) +
                   dVar453 * dVar77 +
                   dVar382 * dVar66 * dVar77 * 0.5 +
                   (dVar320 * dVar77 * 26880.0 +
                   dVar344 * dVar77 * -2880.0 +
                   dVar163 * dVar77 * 768.0 + dVar77 * -1105920.0 * dVar116 + dVar77 * -8.0) *
                   dVar66);
        }
        else {
          dVar77 = (double)(uVar23 & (ulong)dVar77);
          auVar200._0_8_ = dVar321 * dVar77;
          auVar200._8_8_ = dVar422 * dVar77;
          auVar125 = divpd(auVar200,_DAT_01095640);
          auVar201._0_8_ = local_7b8 * dVar77;
          auVar201._8_8_ = dStack_7b0 * dVar77;
          auVar266 = divpd(auVar201,_DAT_01095650);
          auVar232._0_8_ = dVar385 * dVar77;
          auVar232._8_8_ = dVar394 * dVar77;
          auVar246 = divpd(auVar232,_DAT_01095660);
          auVar202._0_8_ = dVar437 * dVar77;
          auVar202._8_8_ = dVar449 * dVar77;
          auVar417 = divpd(auVar202,_DAT_01095670);
          auVar377._0_8_ = dVar426 * dVar77;
          auVar377._8_8_ = dVar436 * dVar77;
          auVar215 = divpd(auVar377,_DAT_01095680);
          auVar409._0_8_ = local_b28 * dVar77;
          auVar409._8_8_ = dStack_b20 * dVar77;
          auVar166 = divpd(auVar409,_DAT_01095690);
          dVar77 = (((((((((((((dVar75 * dVar77) / 8272281600.0 +
                              (dVar366 * dVar77) / -210862080.0 +
                              (dVar442 * dVar77) / 6150144.0 +
                              dVar265 * dVar77 * -4.6972703222703225e-06 +
                              dVar414 * dVar77 + (dVar398 * dVar77) / 9408.0) - auVar125._8_8_) +
                            auVar125._0_8_) - auVar266._8_8_) + auVar266._0_8_) - auVar246._8_8_) +
                        auVar246._0_8_) - auVar417._8_8_) + auVar417._0_8_) - auVar215._8_8_) +
                    auVar215._0_8_) - auVar166._8_8_) + auVar166._0_8_;
        }
        dVar27 = 0.0;
        if (dVar1 < __x_00) {
          dVar27 = dVar68 * (dVar242 * -0.010531842222222223 * dVar111 * dVar56 * dVar25 +
                            dVar77 * 1.8171205928321397 * dVar34 * 0.026329605555555555 * dVar213 +
                            dVar98 * dVar34 * dVar56 * dVar25 +
                            dVar159 * dVar241 * 0.018276169650205763 * dVar162 +
                            dVar161 * (dVar30 + dVar114) * 0.43209876543209874 * dVar162 +
                            (dVar60 + dVar26) * dVar211 + (local_a38 * dVar25) / -5.0 +
                            dVar34 * dVar159 * dVar62 *
                            dVar263 * 1.8171205928321397 * 0.026329605555555555);
        }
        if ((pdVar4 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vsigma * sVar9;
          pdVar4[lVar7 + 2] = dVar27 * __x + pdVar4[lVar7 + 2];
        }
        pdVar4 = out->vlapl;
        if ((pdVar4 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
          lVar7 = (long)(p->dim).vlapl * sVar9;
          dVar77 = (pdVar4 + lVar7)[1];
          pdVar4[lVar7] = pdVar4[lVar7] + 0.0;
          (pdVar4 + lVar7)[1] = dVar77 + 0.0;
        }
        pdVar4 = out->vtau;
        if ((pdVar4 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          lVar7 = (long)(p->dim).vtau * sVar9;
          pdVar4[lVar7] =
               (double)(~uVar17 &
                       (ulong)((dVar100 / dVar24) * 1.8171205928321397 * dVar47 * dVar34 *
                              dVar235 * dVar29 * dVar46 * 1.4422495703074083 * 0.01610215409462904))
               * __x + pdVar4[lVar7];
        }
        if ((pdVar4 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          lVar7 = (long)(p->dim).vtau * sVar9;
          pdVar4[lVar7 + 1] =
               __x * (double)(~-(ulong)(__x_00 <= dVar1) &
                             (ulong)((dVar158 / __x_00) * 1.8171205928321397 * dVar34 * dVar62 *
                                    dVar29 * dVar241 * dVar316 * 1.4422495703074083 *
                                    0.01610215409462904)) + pdVar4[lVar7 + 1];
        }
      }
      sVar9 = sVar9 + 1;
    } while (np != sVar9);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}